

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  RayQueryContext *pRVar24;
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ulong uVar32;
  bool bVar33;
  uint uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  float fVar97;
  float fVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  float t1;
  undefined4 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vfloat4 b0;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  vfloat4 b0_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  vfloat4 a0_3;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  vfloat4 a0_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [16];
  float fVar202;
  float fVar204;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar206;
  float fVar207;
  float fVar217;
  float fVar218;
  vfloat4 a0_1;
  undefined1 auVar208 [16];
  float fVar219;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  vfloat4 a0;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_378 [16];
  RayQueryContext *local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar28;
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  
  PVar6 = prim[1];
  uVar32 = (ulong)(byte)PVar6;
  fVar206 = *(float *)(prim + uVar32 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar41 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar43 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar32 * 0x19 + 6));
  fVar119 = fVar206 * auVar43._0_4_;
  fVar97 = fVar206 * auVar41._0_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar32 * 4 + 6);
  auVar68 = vpmovsxbd_avx2(auVar40);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar32 * 5 + 6);
  auVar66 = vpmovsxbd_avx2(auVar48);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar32 * 6 + 6);
  auVar79 = vpmovsxbd_avx2(auVar47);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar32 * 0xb + 6);
  auVar80 = vpmovsxbd_avx2(auVar46);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar72 = vpmovsxbd_avx2(auVar49);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar72);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar32 + 6);
  auVar67 = vpmovsxbd_avx2(auVar4);
  auVar67 = vcvtdq2ps_avx(auVar67);
  uVar35 = (ulong)(uint)((int)(uVar32 * 9) * 2);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar69 = vpmovsxbd_avx2(auVar45);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar35 + uVar32 + 6);
  auVar70 = vpmovsxbd_avx2(auVar44);
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar27 = (ulong)(uint)((int)(uVar32 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar27 + 6);
  auVar65 = vpmovsxbd_avx2(auVar5);
  auVar71 = vcvtdq2ps_avx(auVar65);
  auVar128._4_4_ = fVar97;
  auVar128._0_4_ = fVar97;
  auVar128._8_4_ = fVar97;
  auVar128._12_4_ = fVar97;
  auVar128._16_4_ = fVar97;
  auVar128._20_4_ = fVar97;
  auVar128._24_4_ = fVar97;
  auVar128._28_4_ = fVar97;
  auVar232._8_4_ = 1;
  auVar232._0_8_ = 0x100000001;
  auVar232._12_4_ = 1;
  auVar232._16_4_ = 1;
  auVar232._20_4_ = 1;
  auVar232._24_4_ = 1;
  auVar232._28_4_ = 1;
  auVar63 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar74 = ZEXT1632(CONCAT412(fVar206 * auVar41._12_4_,
                               CONCAT48(fVar206 * auVar41._8_4_,
                                        CONCAT44(fVar206 * auVar41._4_4_,fVar97))));
  auVar73 = vpermps_avx2(auVar232,auVar74);
  auVar64 = vpermps_avx512vl(auVar63,auVar74);
  fVar97 = auVar64._0_4_;
  fVar202 = auVar64._4_4_;
  auVar74._4_4_ = fVar202 * auVar79._4_4_;
  auVar74._0_4_ = fVar97 * auVar79._0_4_;
  fVar204 = auVar64._8_4_;
  auVar74._8_4_ = fVar204 * auVar79._8_4_;
  fVar102 = auVar64._12_4_;
  auVar74._12_4_ = fVar102 * auVar79._12_4_;
  fVar103 = auVar64._16_4_;
  auVar74._16_4_ = fVar103 * auVar79._16_4_;
  fVar104 = auVar64._20_4_;
  auVar74._20_4_ = fVar104 * auVar79._20_4_;
  fVar105 = auVar64._24_4_;
  auVar74._24_4_ = fVar105 * auVar79._24_4_;
  auVar74._28_4_ = auVar72._28_4_;
  auVar72._4_4_ = auVar67._4_4_ * fVar202;
  auVar72._0_4_ = auVar67._0_4_ * fVar97;
  auVar72._8_4_ = auVar67._8_4_ * fVar204;
  auVar72._12_4_ = auVar67._12_4_ * fVar102;
  auVar72._16_4_ = auVar67._16_4_ * fVar103;
  auVar72._20_4_ = auVar67._20_4_ * fVar104;
  auVar72._24_4_ = auVar67._24_4_ * fVar105;
  auVar72._28_4_ = auVar65._28_4_;
  auVar65._4_4_ = auVar71._4_4_ * fVar202;
  auVar65._0_4_ = auVar71._0_4_ * fVar97;
  auVar65._8_4_ = auVar71._8_4_ * fVar204;
  auVar65._12_4_ = auVar71._12_4_ * fVar102;
  auVar65._16_4_ = auVar71._16_4_ * fVar103;
  auVar65._20_4_ = auVar71._20_4_ * fVar104;
  auVar65._24_4_ = auVar71._24_4_ * fVar105;
  auVar65._28_4_ = auVar64._28_4_;
  auVar40 = vfmadd231ps_fma(auVar74,auVar73,auVar66);
  auVar48 = vfmadd231ps_fma(auVar72,auVar73,auVar81);
  auVar47 = vfmadd231ps_fma(auVar65,auVar70,auVar73);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar128,auVar68);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar128,auVar80);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar69,auVar128);
  auVar140._4_4_ = fVar119;
  auVar140._0_4_ = fVar119;
  auVar140._8_4_ = fVar119;
  auVar140._12_4_ = fVar119;
  auVar140._16_4_ = fVar119;
  auVar140._20_4_ = fVar119;
  auVar140._24_4_ = fVar119;
  auVar140._28_4_ = fVar119;
  auVar65 = ZEXT1632(CONCAT412(fVar206 * auVar43._12_4_,
                               CONCAT48(fVar206 * auVar43._8_4_,
                                        CONCAT44(fVar206 * auVar43._4_4_,fVar119))));
  auVar72 = vpermps_avx2(auVar232,auVar65);
  auVar65 = vpermps_avx512vl(auVar63,auVar65);
  fVar206 = auVar65._0_4_;
  fVar97 = auVar65._4_4_;
  auVar73._4_4_ = fVar97 * auVar79._4_4_;
  auVar73._0_4_ = fVar206 * auVar79._0_4_;
  fVar202 = auVar65._8_4_;
  auVar73._8_4_ = fVar202 * auVar79._8_4_;
  fVar204 = auVar65._12_4_;
  auVar73._12_4_ = fVar204 * auVar79._12_4_;
  fVar102 = auVar65._16_4_;
  auVar73._16_4_ = fVar102 * auVar79._16_4_;
  fVar103 = auVar65._20_4_;
  auVar73._20_4_ = fVar103 * auVar79._20_4_;
  fVar104 = auVar65._24_4_;
  auVar73._24_4_ = fVar104 * auVar79._24_4_;
  auVar73._28_4_ = 1;
  auVar63._4_4_ = auVar67._4_4_ * fVar97;
  auVar63._0_4_ = auVar67._0_4_ * fVar206;
  auVar63._8_4_ = auVar67._8_4_ * fVar202;
  auVar63._12_4_ = auVar67._12_4_ * fVar204;
  auVar63._16_4_ = auVar67._16_4_ * fVar102;
  auVar63._20_4_ = auVar67._20_4_ * fVar103;
  auVar63._24_4_ = auVar67._24_4_ * fVar104;
  auVar63._28_4_ = auVar79._28_4_;
  auVar67._4_4_ = auVar71._4_4_ * fVar97;
  auVar67._0_4_ = auVar71._0_4_ * fVar206;
  auVar67._8_4_ = auVar71._8_4_ * fVar202;
  auVar67._12_4_ = auVar71._12_4_ * fVar204;
  auVar67._16_4_ = auVar71._16_4_ * fVar102;
  auVar67._20_4_ = auVar71._20_4_ * fVar103;
  auVar67._24_4_ = auVar71._24_4_ * fVar104;
  auVar67._28_4_ = auVar65._28_4_;
  auVar46 = vfmadd231ps_fma(auVar73,auVar72,auVar66);
  auVar49 = vfmadd231ps_fma(auVar63,auVar72,auVar81);
  auVar4 = vfmadd231ps_fma(auVar67,auVar72,auVar70);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar140,auVar68);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar140,auVar80);
  auVar82._8_4_ = 0x7fffffff;
  auVar82._0_8_ = 0x7fffffff7fffffff;
  auVar82._12_4_ = 0x7fffffff;
  auVar82._16_4_ = 0x7fffffff;
  auVar82._20_4_ = 0x7fffffff;
  auVar82._24_4_ = 0x7fffffff;
  auVar82._28_4_ = 0x7fffffff;
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar140,auVar69);
  auVar68 = vandps_avx(ZEXT1632(auVar40),auVar82);
  auVar84._8_4_ = 0x219392ef;
  auVar84._0_8_ = 0x219392ef219392ef;
  auVar84._12_4_ = 0x219392ef;
  auVar84._16_4_ = 0x219392ef;
  auVar84._20_4_ = 0x219392ef;
  auVar84._24_4_ = 0x219392ef;
  auVar84._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar68,auVar84,1);
  bVar33 = (bool)((byte)uVar35 & 1);
  auVar64._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._0_4_;
  bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._4_4_;
  bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._8_4_;
  bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._12_4_;
  auVar64._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar64._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar64._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar64._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar68 = vandps_avx(ZEXT1632(auVar48),auVar82);
  uVar35 = vcmpps_avx512vl(auVar68,auVar84,1);
  bVar33 = (bool)((byte)uVar35 & 1);
  auVar75._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._0_4_;
  bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._4_4_;
  bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._8_4_;
  bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar48._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar68 = vandps_avx(ZEXT1632(auVar47),auVar82);
  uVar35 = vcmpps_avx512vl(auVar68,auVar84,1);
  bVar33 = (bool)((byte)uVar35 & 1);
  auVar68._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._0_4_;
  bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._4_4_;
  bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._8_4_;
  bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar47._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar66 = vrcp14ps_avx512vl(auVar64);
  auVar83._8_4_ = 0x3f800000;
  auVar83._0_8_ = 0x3f8000003f800000;
  auVar83._12_4_ = 0x3f800000;
  auVar83._16_4_ = 0x3f800000;
  auVar83._20_4_ = 0x3f800000;
  auVar83._24_4_ = 0x3f800000;
  auVar83._28_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar64,auVar66,auVar83);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar75);
  auVar48 = vfnmadd213ps_fma(auVar75,auVar66,auVar83);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar68);
  auVar47 = vfnmadd213ps_fma(auVar68,auVar66,auVar83);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar66,auVar66);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 7 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar46));
  auVar69._4_4_ = auVar40._4_4_ * auVar68._4_4_;
  auVar69._0_4_ = auVar40._0_4_ * auVar68._0_4_;
  auVar69._8_4_ = auVar40._8_4_ * auVar68._8_4_;
  auVar69._12_4_ = auVar40._12_4_ * auVar68._12_4_;
  auVar69._16_4_ = auVar68._16_4_ * 0.0;
  auVar69._20_4_ = auVar68._20_4_ * 0.0;
  auVar69._24_4_ = auVar68._24_4_ * 0.0;
  auVar69._28_4_ = auVar68._28_4_;
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 9 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar46));
  auVar67 = vpbroadcastd_avx512vl();
  auVar66 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar78._0_4_ = auVar40._0_4_ * auVar68._0_4_;
  auVar78._4_4_ = auVar40._4_4_ * auVar68._4_4_;
  auVar78._8_4_ = auVar40._8_4_ * auVar68._8_4_;
  auVar78._12_4_ = auVar40._12_4_ * auVar68._12_4_;
  auVar78._16_4_ = auVar68._16_4_ * 0.0;
  auVar78._20_4_ = auVar68._20_4_ * 0.0;
  auVar78._24_4_ = auVar68._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar32 * -2 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar49));
  auVar70._4_4_ = auVar48._4_4_ * auVar68._4_4_;
  auVar70._0_4_ = auVar48._0_4_ * auVar68._0_4_;
  auVar70._8_4_ = auVar48._8_4_ * auVar68._8_4_;
  auVar70._12_4_ = auVar48._12_4_ * auVar68._12_4_;
  auVar70._16_4_ = auVar68._16_4_ * 0.0;
  auVar70._20_4_ = auVar68._20_4_ * 0.0;
  auVar70._24_4_ = auVar68._24_4_ * 0.0;
  auVar70._28_4_ = auVar68._28_4_;
  auVar68 = vcvtdq2ps_avx(auVar66);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar49));
  auVar77._0_4_ = auVar48._0_4_ * auVar68._0_4_;
  auVar77._4_4_ = auVar48._4_4_ * auVar68._4_4_;
  auVar77._8_4_ = auVar48._8_4_ * auVar68._8_4_;
  auVar77._12_4_ = auVar48._12_4_ * auVar68._12_4_;
  auVar77._16_4_ = auVar68._16_4_ * 0.0;
  auVar77._20_4_ = auVar68._20_4_ * 0.0;
  auVar77._24_4_ = auVar68._24_4_ * 0.0;
  auVar77._28_4_ = 0;
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 + uVar32 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar4));
  auVar71._4_4_ = auVar68._4_4_ * auVar47._4_4_;
  auVar71._0_4_ = auVar68._0_4_ * auVar47._0_4_;
  auVar71._8_4_ = auVar68._8_4_ * auVar47._8_4_;
  auVar71._12_4_ = auVar68._12_4_ * auVar47._12_4_;
  auVar71._16_4_ = auVar68._16_4_ * 0.0;
  auVar71._20_4_ = auVar68._20_4_ * 0.0;
  auVar71._24_4_ = auVar68._24_4_ * 0.0;
  auVar71._28_4_ = auVar68._28_4_;
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar32 * 0x17 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar4));
  auVar76._0_4_ = auVar47._0_4_ * auVar68._0_4_;
  auVar76._4_4_ = auVar47._4_4_ * auVar68._4_4_;
  auVar76._8_4_ = auVar47._8_4_ * auVar68._8_4_;
  auVar76._12_4_ = auVar47._12_4_ * auVar68._12_4_;
  auVar76._16_4_ = auVar68._16_4_ * 0.0;
  auVar76._20_4_ = auVar68._20_4_ * 0.0;
  auVar76._24_4_ = auVar68._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar68 = vpminsd_avx2(auVar69,auVar78);
  auVar66 = vpminsd_avx2(auVar70,auVar77);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar66 = vpminsd_avx2(auVar71,auVar76);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar79._4_4_ = uVar106;
  auVar79._0_4_ = uVar106;
  auVar79._8_4_ = uVar106;
  auVar79._12_4_ = uVar106;
  auVar79._16_4_ = uVar106;
  auVar79._20_4_ = uVar106;
  auVar79._24_4_ = uVar106;
  auVar79._28_4_ = uVar106;
  auVar66 = vmaxps_avx512vl(auVar66,auVar79);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar66._8_4_ = 0x3f7ffffa;
  auVar66._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar66._12_4_ = 0x3f7ffffa;
  auVar66._16_4_ = 0x3f7ffffa;
  auVar66._20_4_ = 0x3f7ffffa;
  auVar66._24_4_ = 0x3f7ffffa;
  auVar66._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar68,auVar66);
  auVar68 = vpmaxsd_avx2(auVar69,auVar78);
  auVar66 = vpmaxsd_avx2(auVar70,auVar77);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar66 = vpmaxsd_avx2(auVar71,auVar76);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar80._4_4_ = uVar106;
  auVar80._0_4_ = uVar106;
  auVar80._8_4_ = uVar106;
  auVar80._12_4_ = uVar106;
  auVar80._16_4_ = uVar106;
  auVar80._20_4_ = uVar106;
  auVar80._24_4_ = uVar106;
  auVar80._28_4_ = uVar106;
  auVar66 = vminps_avx512vl(auVar66,auVar80);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar81._8_4_ = 0x3f800003;
  auVar81._0_8_ = 0x3f8000033f800003;
  auVar81._12_4_ = 0x3f800003;
  auVar81._16_4_ = 0x3f800003;
  auVar81._20_4_ = 0x3f800003;
  auVar81._24_4_ = 0x3f800003;
  auVar81._28_4_ = 0x3f800003;
  auVar68 = vmulps_avx512vl(auVar68,auVar81);
  uVar13 = vpcmpgtd_avx512vl(auVar67,_DAT_01fe9900);
  uVar12 = vcmpps_avx512vl(local_78,auVar68,2);
  if ((byte)((byte)uVar12 & (byte)uVar13) == 0) {
    return false;
  }
  uVar35 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  local_2d8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar233 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar234 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar235 = ZEXT1664(auVar40);
  auVar242 = ZEXT464(0x3f800000);
  auVar40 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar241 = ZEXT1664(auVar40);
  local_360 = context;
LAB_01c945f3:
  pRVar24 = local_360;
  lVar29 = 0;
  for (uVar27 = uVar35; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar34 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar34].ptr;
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar29 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar40 = *(undefined1 (*) [16])(_Var11 + uVar27 * (long)pvVar10);
  auVar48 = *(undefined1 (*) [16])(_Var11 + (uVar27 + 1) * (long)pvVar10);
  auVar47 = *(undefined1 (*) [16])(_Var11 + (uVar27 + 2) * (long)pvVar10);
  auVar46 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar27 + 3));
  lVar29 = *(long *)&pGVar8[1].time_range.upper;
  auVar49 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * uVar27);
  auVar4 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * (uVar27 + 1));
  auVar45 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * (uVar27 + 2));
  uVar35 = uVar35 - 1 & uVar35;
  auVar44 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * (uVar27 + 3));
  if (uVar35 != 0) {
    uVar32 = uVar35 - 1 & uVar35;
    for (uVar27 = uVar35; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    }
    if (uVar32 != 0) {
      for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar107 = ZEXT816(0) << 0x40;
  auVar43._0_4_ = auVar44._0_4_ * 0.0;
  auVar43._4_4_ = auVar44._4_4_ * 0.0;
  auVar43._8_4_ = auVar44._8_4_ * 0.0;
  auVar43._12_4_ = auVar44._12_4_ * 0.0;
  auVar43 = vfmadd231ps_fma(auVar43,auVar45,auVar107);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar43);
  auVar111._0_4_ = auVar49._0_4_ + auVar41._0_4_;
  auVar111._4_4_ = auVar49._4_4_ + auVar41._4_4_;
  auVar111._8_4_ = auVar49._8_4_ + auVar41._8_4_;
  auVar111._12_4_ = auVar49._12_4_ + auVar41._12_4_;
  auVar108 = auVar233._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar43,auVar4,auVar108);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar49,auVar108);
  auVar208._0_4_ = auVar46._0_4_ * 0.0;
  auVar208._4_4_ = auVar46._4_4_ * 0.0;
  auVar208._8_4_ = auVar46._8_4_ * 0.0;
  auVar208._12_4_ = auVar46._12_4_ * 0.0;
  auVar43 = vfmadd231ps_fma(auVar208,auVar47,auVar107);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar43);
  auVar220._0_4_ = auVar40._0_4_ + auVar41._0_4_;
  auVar220._4_4_ = auVar40._4_4_ + auVar41._4_4_;
  auVar220._8_4_ = auVar40._8_4_ + auVar41._8_4_;
  auVar220._12_4_ = auVar40._12_4_ + auVar41._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar108);
  auVar43 = vfnmadd231ps_avx512vl(auVar41,auVar40,auVar108);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar45,auVar44);
  auVar41 = vfmadd231ps_fma(auVar41,auVar4,auVar107);
  auVar41 = vfmadd231ps_fma(auVar41,auVar49,auVar107);
  auVar44 = vmulps_avx512vl(auVar44,auVar108);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar108,auVar45);
  auVar4 = vfmadd231ps_fma(auVar45,auVar107,auVar4);
  auVar45 = vfnmadd231ps_fma(auVar4,auVar107,auVar49);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar46);
  auVar49 = vfmadd231ps_fma(auVar49,auVar48,auVar107);
  auVar49 = vfmadd231ps_fma(auVar49,auVar40,auVar107);
  auVar46 = vmulps_avx512vl(auVar46,auVar108);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar108,auVar47);
  auVar48 = vfmadd231ps_fma(auVar47,auVar107,auVar48);
  auVar4 = vfnmadd231ps_fma(auVar48,auVar107,auVar40);
  auVar40 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar48 = vshufps_avx(auVar220,auVar220,0xc9);
  fVar102 = auVar42._0_4_;
  auVar52._0_4_ = fVar102 * auVar48._0_4_;
  fVar103 = auVar42._4_4_;
  auVar52._4_4_ = fVar103 * auVar48._4_4_;
  fVar104 = auVar42._8_4_;
  auVar52._8_4_ = fVar104 * auVar48._8_4_;
  fVar105 = auVar42._12_4_;
  auVar52._12_4_ = fVar105 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar52,auVar40,auVar220);
  auVar47 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar53._0_4_ = fVar102 * auVar48._0_4_;
  auVar53._4_4_ = fVar103 * auVar48._4_4_;
  auVar53._8_4_ = fVar104 * auVar48._8_4_;
  auVar53._12_4_ = fVar105 * auVar48._12_4_;
  auVar40 = vfmsub231ps_fma(auVar53,auVar40,auVar43);
  auVar46 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar48 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar119 = auVar45._0_4_;
  auVar57._0_4_ = fVar119 * auVar48._0_4_;
  fVar130 = auVar45._4_4_;
  auVar57._4_4_ = fVar130 * auVar48._4_4_;
  fVar131 = auVar45._8_4_;
  auVar57._8_4_ = fVar131 * auVar48._8_4_;
  fVar132 = auVar45._12_4_;
  auVar57._12_4_ = fVar132 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar57,auVar40,auVar49);
  auVar49 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar172._0_4_ = auVar48._0_4_ * fVar119;
  auVar172._4_4_ = auVar48._4_4_ * fVar130;
  auVar172._8_4_ = auVar48._8_4_ * fVar131;
  auVar172._12_4_ = auVar48._12_4_ * fVar132;
  auVar40 = vfmsub231ps_fma(auVar172,auVar40,auVar4);
  auVar4 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar47,auVar47,0x7f);
  fVar206 = auVar40._0_4_;
  auVar173._4_12_ = ZEXT812(0) << 0x20;
  auVar173._0_4_ = fVar206;
  auVar48 = vrsqrt14ss_avx512f(auVar107,auVar173);
  auVar44 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar97 = auVar48._0_4_;
  fVar202 = auVar44._0_4_ - auVar43._0_4_ * fVar97 * fVar97 * fVar97;
  fVar207 = fVar202 * auVar47._0_4_;
  fVar217 = fVar202 * auVar47._4_4_;
  fVar218 = fVar202 * auVar47._8_4_;
  fVar219 = fVar202 * auVar47._12_4_;
  auVar48 = vdpps_avx(auVar47,auVar46,0x7f);
  auVar184._0_4_ = auVar46._0_4_ * fVar206;
  auVar184._4_4_ = auVar46._4_4_ * fVar206;
  auVar184._8_4_ = auVar46._8_4_ * fVar206;
  auVar184._12_4_ = auVar46._12_4_ * fVar206;
  fVar206 = auVar48._0_4_;
  auVar151._0_4_ = fVar206 * auVar47._0_4_;
  auVar151._4_4_ = fVar206 * auVar47._4_4_;
  auVar151._8_4_ = fVar206 * auVar47._8_4_;
  auVar151._12_4_ = fVar206 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar184,auVar151);
  auVar48 = vrcp14ss_avx512f(auVar107,auVar173);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  fVar206 = auVar48._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar49,auVar49,0x7f);
  fVar97 = auVar40._0_4_;
  auVar163._4_12_ = ZEXT812(0) << 0x20;
  auVar163._0_4_ = fVar97;
  auVar48 = vrsqrt14ss_avx512f(auVar107,auVar163);
  auVar46 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
  auVar44 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar204 = auVar48._0_4_;
  fVar204 = auVar46._0_4_ - auVar44._0_4_ * fVar204 * fVar204 * fVar204;
  fVar191 = fVar204 * auVar49._0_4_;
  fVar201 = fVar204 * auVar49._4_4_;
  fVar203 = fVar204 * auVar49._8_4_;
  fVar205 = fVar204 * auVar49._12_4_;
  auVar48 = vdpps_avx(auVar49,auVar4,0x7f);
  auVar60._0_4_ = fVar97 * auVar4._0_4_;
  auVar60._4_4_ = fVar97 * auVar4._4_4_;
  auVar60._8_4_ = fVar97 * auVar4._8_4_;
  auVar60._12_4_ = fVar97 * auVar4._12_4_;
  fVar97 = auVar48._0_4_;
  auVar133._0_4_ = fVar97 * auVar49._0_4_;
  auVar133._4_4_ = fVar97 * auVar49._4_4_;
  auVar133._8_4_ = fVar97 * auVar49._8_4_;
  auVar133._12_4_ = fVar97 * auVar49._12_4_;
  auVar46 = vsubps_avx(auVar60,auVar133);
  auVar48 = vrcp14ss_avx512f(auVar107,auVar163);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar48,ZEXT416(0x40000000));
  fVar97 = auVar40._0_4_ * auVar48._0_4_;
  auVar40 = vshufps_avx(auVar111,auVar111,0xff);
  auVar164._0_4_ = fVar207 * auVar40._0_4_;
  auVar164._4_4_ = fVar217 * auVar40._4_4_;
  auVar164._8_4_ = fVar218 * auVar40._8_4_;
  auVar164._12_4_ = fVar219 * auVar40._12_4_;
  local_1f8 = vsubps_avx(auVar111,auVar164);
  auVar48 = vshufps_avx(auVar42,auVar42,0xff);
  auVar61._0_4_ = auVar48._0_4_ * fVar207 + auVar40._0_4_ * fVar202 * fVar206 * auVar47._0_4_;
  auVar61._4_4_ = auVar48._4_4_ * fVar217 + auVar40._4_4_ * fVar202 * fVar206 * auVar47._4_4_;
  auVar61._8_4_ = auVar48._8_4_ * fVar218 + auVar40._8_4_ * fVar202 * fVar206 * auVar47._8_4_;
  auVar61._12_4_ = auVar48._12_4_ * fVar219 + auVar40._12_4_ * fVar202 * fVar206 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar42,auVar61);
  local_208._0_4_ = auVar164._0_4_ + auVar111._0_4_;
  local_208._4_4_ = auVar164._4_4_ + auVar111._4_4_;
  fStack_200 = auVar164._8_4_ + auVar111._8_4_;
  fStack_1fc = auVar164._12_4_ + auVar111._12_4_;
  auVar40 = vshufps_avx(auVar41,auVar41,0xff);
  auVar143._0_4_ = fVar191 * auVar40._0_4_;
  auVar143._4_4_ = fVar201 * auVar40._4_4_;
  auVar143._8_4_ = fVar203 * auVar40._8_4_;
  auVar143._12_4_ = fVar205 * auVar40._12_4_;
  local_218 = vsubps_avx(auVar41,auVar143);
  auVar48 = vshufps_avx(auVar45,auVar45,0xff);
  auVar51._0_4_ = auVar48._0_4_ * fVar191 + auVar40._0_4_ * fVar204 * auVar46._0_4_ * fVar97;
  auVar51._4_4_ = auVar48._4_4_ * fVar201 + auVar40._4_4_ * fVar204 * auVar46._4_4_ * fVar97;
  auVar51._8_4_ = auVar48._8_4_ * fVar203 + auVar40._8_4_ * fVar204 * auVar46._8_4_ * fVar97;
  auVar51._12_4_ = auVar48._12_4_ * fVar205 + auVar40._12_4_ * fVar204 * auVar46._12_4_ * fVar97;
  auVar40 = vsubps_avx(auVar45,auVar51);
  _local_228 = vaddps_avx512vl(auVar41,auVar143);
  auVar54._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar54._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar54._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar54._12_4_ = auVar47._12_4_ * 0.33333334;
  local_238 = vaddps_avx512vl(local_1f8,auVar54);
  auVar55._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar55._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar55._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar55._12_4_ = auVar40._12_4_ * 0.33333334;
  local_248 = vsubps_avx512vl(local_218,auVar55);
  auVar42._0_4_ = (fVar102 + auVar61._0_4_) * 0.33333334;
  auVar42._4_4_ = (fVar103 + auVar61._4_4_) * 0.33333334;
  auVar42._8_4_ = (fVar104 + auVar61._8_4_) * 0.33333334;
  auVar42._12_4_ = (fVar105 + auVar61._12_4_) * 0.33333334;
  _local_258 = vaddps_avx512vl(_local_208,auVar42);
  auVar107._0_4_ = (fVar119 + auVar51._0_4_) * 0.33333334;
  auVar107._4_4_ = (fVar130 + auVar51._4_4_) * 0.33333334;
  auVar107._8_4_ = (fVar131 + auVar51._8_4_) * 0.33333334;
  auVar107._12_4_ = (fVar132 + auVar51._12_4_) * 0.33333334;
  _local_268 = vsubps_avx512vl(_local_228,auVar107);
  local_178 = vsubps_avx(local_1f8,auVar5);
  uVar106 = local_178._0_4_;
  auVar59._4_4_ = uVar106;
  auVar59._0_4_ = uVar106;
  auVar59._8_4_ = uVar106;
  auVar59._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_178,local_178,0x55);
  auVar48 = vshufps_avx(local_178,local_178,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar206 = pre->ray_space[k].vz.field_0.m128[0];
  fVar97 = pre->ray_space[k].vz.field_0.m128[1];
  fVar202 = pre->ray_space[k].vz.field_0.m128[2];
  fVar204 = pre->ray_space[k].vz.field_0.m128[3];
  auVar108._0_4_ = fVar206 * auVar48._0_4_;
  auVar108._4_4_ = fVar97 * auVar48._4_4_;
  auVar108._8_4_ = fVar202 * auVar48._8_4_;
  auVar108._12_4_ = fVar204 * auVar48._12_4_;
  auVar40 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar3,auVar40);
  auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar59);
  local_188 = vsubps_avx512vl(local_238,auVar5);
  uVar106 = local_188._0_4_;
  auVar58._4_4_ = uVar106;
  auVar58._0_4_ = uVar106;
  auVar58._8_4_ = uVar106;
  auVar58._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_188,local_188,0x55);
  auVar48 = vshufps_avx(local_188,local_188,0xaa);
  auVar62._0_4_ = fVar206 * auVar48._0_4_;
  auVar62._4_4_ = fVar97 * auVar48._4_4_;
  auVar62._8_4_ = fVar202 * auVar48._8_4_;
  auVar62._12_4_ = fVar204 * auVar48._12_4_;
  auVar40 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar3,auVar40);
  auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar58);
  local_198 = vsubps_avx512vl(local_248,auVar5);
  uVar106 = local_198._0_4_;
  auVar152._4_4_ = uVar106;
  auVar152._0_4_ = uVar106;
  auVar152._8_4_ = uVar106;
  auVar152._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_198,local_198,0x55);
  auVar48 = vshufps_avx(local_198,local_198,0xaa);
  auVar56._0_4_ = fVar206 * auVar48._0_4_;
  auVar56._4_4_ = fVar97 * auVar48._4_4_;
  auVar56._8_4_ = fVar202 * auVar48._8_4_;
  auVar56._12_4_ = fVar204 * auVar48._12_4_;
  auVar40 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar3,auVar40);
  auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar152);
  local_1a8 = vsubps_avx(local_218,auVar5);
  uVar106 = local_1a8._0_4_;
  auVar153._4_4_ = uVar106;
  auVar153._0_4_ = uVar106;
  auVar153._8_4_ = uVar106;
  auVar153._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar48 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar174._0_4_ = auVar48._0_4_ * fVar206;
  auVar174._4_4_ = auVar48._4_4_ * fVar97;
  auVar174._8_4_ = auVar48._8_4_ * fVar202;
  auVar174._12_4_ = auVar48._12_4_ * fVar204;
  auVar40 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar3,auVar40);
  auVar42 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar153);
  local_1b8 = vsubps_avx(_local_208,auVar5);
  uVar106 = local_1b8._0_4_;
  auVar154._4_4_ = uVar106;
  auVar154._0_4_ = uVar106;
  auVar154._8_4_ = uVar106;
  auVar154._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar48 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar185._0_4_ = auVar48._0_4_ * fVar206;
  auVar185._4_4_ = auVar48._4_4_ * fVar97;
  auVar185._8_4_ = auVar48._8_4_ * fVar202;
  auVar185._12_4_ = auVar48._12_4_ * fVar204;
  auVar40 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar3,auVar40);
  auVar107 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar154);
  local_1c8 = vsubps_avx512vl(_local_258,auVar5);
  uVar106 = local_1c8._0_4_;
  auVar155._4_4_ = uVar106;
  auVar155._0_4_ = uVar106;
  auVar155._8_4_ = uVar106;
  auVar155._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar48 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar192._0_4_ = auVar48._0_4_ * fVar206;
  auVar192._4_4_ = auVar48._4_4_ * fVar97;
  auVar192._8_4_ = auVar48._8_4_ * fVar202;
  auVar192._12_4_ = auVar48._12_4_ * fVar204;
  auVar40 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar40);
  auVar108 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar155);
  local_1d8 = vsubps_avx512vl(_local_268,auVar5);
  uVar106 = local_1d8._0_4_;
  auVar156._4_4_ = uVar106;
  auVar156._0_4_ = uVar106;
  auVar156._8_4_ = uVar106;
  auVar156._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar48 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar209._0_4_ = auVar48._0_4_ * fVar206;
  auVar209._4_4_ = auVar48._4_4_ * fVar97;
  auVar209._8_4_ = auVar48._8_4_ * fVar202;
  auVar209._12_4_ = auVar48._12_4_ * fVar204;
  auVar40 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar3,auVar40);
  auVar111 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar156);
  local_1e8 = vsubps_avx512vl(_local_228,auVar5);
  uVar106 = local_1e8._0_4_;
  auVar50._4_4_ = uVar106;
  auVar50._0_4_ = uVar106;
  auVar50._8_4_ = uVar106;
  auVar50._12_4_ = uVar106;
  auVar40 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar48 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar144._0_4_ = auVar48._0_4_ * fVar206;
  auVar144._4_4_ = auVar48._4_4_ * fVar97;
  auVar144._8_4_ = auVar48._8_4_ * fVar202;
  auVar144._12_4_ = auVar48._12_4_ * fVar204;
  auVar40 = vfmadd231ps_fma(auVar144,(undefined1  [16])aVar3,auVar40);
  auVar5 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar50);
  auVar47 = vmovlhps_avx(auVar44,auVar107);
  auVar4 = vmovlhps_avx512f(auVar41,auVar108);
  auVar45 = vmovlhps_avx512f(auVar43,auVar111);
  _local_348 = vmovlhps_avx512f(auVar42,auVar5);
  auVar40 = vminps_avx512vl(auVar47,auVar4);
  auVar46 = vmaxps_avx512vl(auVar47,auVar4);
  auVar48 = vminps_avx512vl(auVar45,_local_348);
  auVar48 = vminps_avx(auVar40,auVar48);
  auVar40 = vmaxps_avx512vl(auVar45,_local_348);
  auVar40 = vmaxps_avx(auVar46,auVar40);
  auVar46 = vshufpd_avx(auVar48,auVar48,3);
  auVar49 = vshufpd_avx(auVar40,auVar40,3);
  auVar48 = vminps_avx(auVar48,auVar46);
  auVar40 = vmaxps_avx(auVar40,auVar49);
  auVar48 = vandps_avx512vl(auVar48,auVar234._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar234._0_16_);
  auVar40 = vmaxps_avx(auVar48,auVar40);
  auVar48 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar48,auVar40);
  auVar157._8_8_ = auVar44._0_8_;
  auVar157._0_8_ = auVar44._0_8_;
  auVar48 = vmovddup_avx512vl(auVar41);
  auVar46 = vmovddup_avx512vl(auVar43);
  auVar109._8_8_ = auVar42._0_8_;
  auVar109._0_8_ = auVar42._0_8_;
  local_358 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
  local_148 = vbroadcastss_avx512vl(local_358);
  auVar40 = vxorps_avx512vl(local_148._0_16_,auVar235._0_16_);
  auVar68 = vbroadcastss_avx512vl(auVar40);
  local_278 = vpbroadcastd_avx512vl();
  bVar33 = false;
  uVar27 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x30);
  auVar49 = vsubps_avx512vl(auVar4,auVar47);
  local_158 = vsubps_avx512vl(auVar45,auVar4);
  local_168 = vsubps_avx512vl(_local_348,auVar45);
  local_288 = vsubps_avx(_local_208,local_1f8);
  local_298 = vsubps_avx512vl(_local_258,local_238);
  local_2a8 = vsubps_avx512vl(_local_268,local_248);
  _local_2b8 = vsubps_avx512vl(_local_228,local_218);
  local_2c8 = vpbroadcastd_avx512vl();
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar41 = auVar40;
LAB_01c94d2d:
  do {
    auVar44 = vshufps_avx(auVar41,auVar41,0x50);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar42 = vsubps_avx512vl(auVar69._0_16_,auVar44);
    fVar206 = auVar44._0_4_;
    fVar102 = auVar107._0_4_;
    auVar126._0_4_ = fVar102 * fVar206;
    fVar97 = auVar44._4_4_;
    fVar103 = auVar107._4_4_;
    auVar126._4_4_ = fVar103 * fVar97;
    fVar202 = auVar44._8_4_;
    auVar126._8_4_ = fVar102 * fVar202;
    fVar204 = auVar44._12_4_;
    auVar126._12_4_ = fVar103 * fVar204;
    fVar104 = auVar108._0_4_;
    auVar134._0_4_ = fVar104 * fVar206;
    fVar105 = auVar108._4_4_;
    auVar134._4_4_ = fVar105 * fVar97;
    auVar134._8_4_ = fVar104 * fVar202;
    auVar134._12_4_ = fVar105 * fVar204;
    fVar119 = auVar111._0_4_;
    auVar145._0_4_ = fVar119 * fVar206;
    fVar130 = auVar111._4_4_;
    auVar145._4_4_ = fVar130 * fVar97;
    auVar145._8_4_ = fVar119 * fVar202;
    auVar145._12_4_ = fVar130 * fVar204;
    fVar131 = auVar5._0_4_;
    auVar112._0_4_ = fVar131 * fVar206;
    fVar132 = auVar5._4_4_;
    auVar112._4_4_ = fVar132 * fVar97;
    auVar112._8_4_ = fVar131 * fVar202;
    auVar112._12_4_ = fVar132 * fVar204;
    auVar43 = vfmadd231ps_fma(auVar126,auVar42,auVar157);
    auVar50 = vfmadd231ps_avx512vl(auVar134,auVar42,auVar48);
    auVar51 = vfmadd231ps_avx512vl(auVar145,auVar42,auVar46);
    auVar42 = vfmadd231ps_fma(auVar112,auVar109,auVar42);
    auVar44 = vmovshdup_avx(auVar40);
    fVar97 = auVar40._0_4_;
    fVar206 = (auVar44._0_4_ - fVar97) * 0.04761905;
    auVar171._4_4_ = fVar97;
    auVar171._0_4_ = fVar97;
    auVar171._8_4_ = fVar97;
    auVar171._12_4_ = fVar97;
    auVar171._16_4_ = fVar97;
    auVar171._20_4_ = fVar97;
    auVar171._24_4_ = fVar97;
    auVar171._28_4_ = fVar97;
    auVar124._0_8_ = auVar44._0_8_;
    auVar124._8_8_ = auVar124._0_8_;
    auVar124._16_8_ = auVar124._0_8_;
    auVar124._24_8_ = auVar124._0_8_;
    auVar66 = vsubps_avx(auVar124,auVar171);
    uVar106 = auVar43._0_4_;
    auVar125._4_4_ = uVar106;
    auVar125._0_4_ = uVar106;
    auVar125._8_4_ = uVar106;
    auVar125._12_4_ = uVar106;
    auVar125._16_4_ = uVar106;
    auVar125._20_4_ = uVar106;
    auVar125._24_4_ = uVar106;
    auVar125._28_4_ = uVar106;
    auVar188._8_4_ = 1;
    auVar188._0_8_ = 0x100000001;
    auVar188._12_4_ = 1;
    auVar188._16_4_ = 1;
    auVar188._20_4_ = 1;
    auVar188._24_4_ = 1;
    auVar188._28_4_ = 1;
    auVar80 = ZEXT1632(auVar43);
    auVar79 = vpermps_avx2(auVar188,auVar80);
    auVar70 = vbroadcastss_avx512vl(auVar50);
    auVar81 = ZEXT1632(auVar50);
    auVar71 = vpermps_avx512vl(auVar188,auVar81);
    auVar72 = vbroadcastss_avx512vl(auVar51);
    auVar67 = ZEXT1632(auVar51);
    auVar65 = vpermps_avx512vl(auVar188,auVar67);
    auVar73 = vbroadcastss_avx512vl(auVar42);
    auVar77 = ZEXT1632(auVar42);
    auVar74 = vpermps_avx512vl(auVar188,auVar77);
    auVar189._4_4_ = fVar206;
    auVar189._0_4_ = fVar206;
    auVar189._8_4_ = fVar206;
    auVar189._12_4_ = fVar206;
    auVar189._16_4_ = fVar206;
    auVar189._20_4_ = fVar206;
    auVar189._24_4_ = fVar206;
    auVar189._28_4_ = fVar206;
    auVar226._8_4_ = 2;
    auVar226._0_8_ = 0x200000002;
    auVar226._12_4_ = 2;
    auVar226._16_4_ = 2;
    auVar226._20_4_ = 2;
    auVar226._24_4_ = 2;
    auVar226._28_4_ = 2;
    auVar63 = vpermps_avx512vl(auVar226,auVar80);
    auVar162._8_4_ = 3;
    auVar162._0_8_ = 0x300000003;
    auVar162._12_4_ = 3;
    auVar162._16_4_ = 3;
    auVar162._20_4_ = 3;
    auVar162._24_4_ = 3;
    auVar162._28_4_ = 3;
    auVar64 = vpermps_avx512vl(auVar162,auVar80);
    auVar75 = vpermps_avx512vl(auVar226,auVar81);
    auVar80 = vpermps_avx2(auVar162,auVar81);
    auVar81 = vpermps_avx2(auVar226,auVar67);
    auVar67 = vpermps_avx2(auVar162,auVar67);
    auVar76 = vpermps_avx512vl(auVar226,auVar77);
    auVar77 = vpermps_avx512vl(auVar162,auVar77);
    auVar44 = vfmadd132ps_fma(auVar66,auVar171,_DAT_01faff20);
    auVar69 = vsubps_avx512vl(auVar69,ZEXT1632(auVar44));
    auVar66 = vmulps_avx512vl(auVar70,ZEXT1632(auVar44));
    auVar82 = ZEXT1632(auVar44);
    auVar78 = vmulps_avx512vl(auVar71,auVar82);
    auVar43 = vfmadd231ps_fma(auVar66,auVar69,auVar125);
    auVar42 = vfmadd231ps_fma(auVar78,auVar69,auVar79);
    auVar66 = vmulps_avx512vl(auVar72,auVar82);
    auVar78 = vmulps_avx512vl(auVar65,auVar82);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar70);
    auVar70 = vfmadd231ps_avx512vl(auVar78,auVar69,auVar71);
    auVar71 = vmulps_avx512vl(auVar73,auVar82);
    auVar78 = ZEXT1632(auVar44);
    auVar74 = vmulps_avx512vl(auVar74,auVar78);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar69,auVar72);
    auVar72 = vfmadd231ps_avx512vl(auVar74,auVar69,auVar65);
    fVar202 = auVar44._0_4_;
    fVar204 = auVar44._4_4_;
    auVar18._4_4_ = fVar204 * auVar66._4_4_;
    auVar18._0_4_ = fVar202 * auVar66._0_4_;
    fVar191 = auVar44._8_4_;
    auVar18._8_4_ = fVar191 * auVar66._8_4_;
    fVar201 = auVar44._12_4_;
    auVar18._12_4_ = fVar201 * auVar66._12_4_;
    auVar18._16_4_ = auVar66._16_4_ * 0.0;
    auVar18._20_4_ = auVar66._20_4_ * 0.0;
    auVar18._24_4_ = auVar66._24_4_ * 0.0;
    auVar18._28_4_ = fVar97;
    auVar19._4_4_ = fVar204 * auVar70._4_4_;
    auVar19._0_4_ = fVar202 * auVar70._0_4_;
    auVar19._8_4_ = fVar191 * auVar70._8_4_;
    auVar19._12_4_ = fVar201 * auVar70._12_4_;
    auVar19._16_4_ = auVar70._16_4_ * 0.0;
    auVar19._20_4_ = auVar70._20_4_ * 0.0;
    auVar19._24_4_ = auVar70._24_4_ * 0.0;
    auVar19._28_4_ = auVar79._28_4_;
    auVar43 = vfmadd231ps_fma(auVar18,auVar69,ZEXT1632(auVar43));
    auVar42 = vfmadd231ps_fma(auVar19,auVar69,ZEXT1632(auVar42));
    auVar117._0_4_ = fVar202 * auVar71._0_4_;
    auVar117._4_4_ = fVar204 * auVar71._4_4_;
    auVar117._8_4_ = fVar191 * auVar71._8_4_;
    auVar117._12_4_ = fVar201 * auVar71._12_4_;
    auVar117._16_4_ = auVar71._16_4_ * 0.0;
    auVar117._20_4_ = auVar71._20_4_ * 0.0;
    auVar117._24_4_ = auVar71._24_4_ * 0.0;
    auVar117._28_4_ = 0;
    auVar20._4_4_ = fVar204 * auVar72._4_4_;
    auVar20._0_4_ = fVar202 * auVar72._0_4_;
    auVar20._8_4_ = fVar191 * auVar72._8_4_;
    auVar20._12_4_ = fVar201 * auVar72._12_4_;
    auVar20._16_4_ = auVar72._16_4_ * 0.0;
    auVar20._20_4_ = auVar72._20_4_ * 0.0;
    auVar20._24_4_ = auVar72._24_4_ * 0.0;
    auVar20._28_4_ = auVar71._28_4_;
    auVar50 = vfmadd231ps_fma(auVar117,auVar69,auVar66);
    auVar51 = vfmadd231ps_fma(auVar20,auVar69,auVar70);
    auVar21._28_4_ = auVar70._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar201 * auVar51._12_4_,
                            CONCAT48(fVar191 * auVar51._8_4_,
                                     CONCAT44(fVar204 * auVar51._4_4_,fVar202 * auVar51._0_4_))));
    auVar59 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar201 * auVar50._12_4_,
                                                 CONCAT48(fVar191 * auVar50._8_4_,
                                                          CONCAT44(fVar204 * auVar50._4_4_,
                                                                   fVar202 * auVar50._0_4_)))),
                              auVar69,ZEXT1632(auVar43));
    auVar62 = vfmadd231ps_fma(auVar21,auVar69,ZEXT1632(auVar42));
    auVar66 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar43));
    auVar79 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar42));
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar66 = vmulps_avx512vl(auVar66,auVar70);
    auVar79 = vmulps_avx512vl(auVar79,auVar70);
    auVar183._0_4_ = fVar206 * auVar66._0_4_;
    auVar183._4_4_ = fVar206 * auVar66._4_4_;
    auVar183._8_4_ = fVar206 * auVar66._8_4_;
    auVar183._12_4_ = fVar206 * auVar66._12_4_;
    auVar183._16_4_ = fVar206 * auVar66._16_4_;
    auVar183._20_4_ = fVar206 * auVar66._20_4_;
    auVar183._24_4_ = fVar206 * auVar66._24_4_;
    auVar183._28_4_ = 0;
    auVar66 = vmulps_avx512vl(auVar189,auVar79);
    auVar42 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar59),_DAT_01feed00,ZEXT1632(auVar42));
    auVar72 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01feed00,ZEXT1632(auVar42));
    auVar118._0_4_ = auVar183._0_4_ + auVar59._0_4_;
    auVar118._4_4_ = auVar183._4_4_ + auVar59._4_4_;
    auVar118._8_4_ = auVar183._8_4_ + auVar59._8_4_;
    auVar118._12_4_ = auVar183._12_4_ + auVar59._12_4_;
    auVar118._16_4_ = auVar183._16_4_ + 0.0;
    auVar118._20_4_ = auVar183._20_4_ + 0.0;
    auVar118._24_4_ = auVar183._24_4_ + 0.0;
    auVar118._28_4_ = 0;
    auVar82 = ZEXT1632(auVar42);
    auVar79 = vpermt2ps_avx512vl(auVar183,_DAT_01feed00,auVar82);
    auVar65 = vaddps_avx512vl(ZEXT1632(auVar62),auVar66);
    auVar73 = vpermt2ps_avx512vl(auVar66,_DAT_01feed00,auVar82);
    auVar66 = vsubps_avx(auVar71,auVar79);
    auVar73 = vsubps_avx512vl(auVar72,auVar73);
    auVar79 = vmulps_avx512vl(auVar75,auVar78);
    auVar74 = vmulps_avx512vl(auVar80,auVar78);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar69,auVar63);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar69,auVar64);
    auVar63 = vmulps_avx512vl(auVar81,auVar78);
    auVar64 = vmulps_avx512vl(auVar67,auVar78);
    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar69,auVar75);
    auVar80 = vfmadd231ps_avx512vl(auVar64,auVar69,auVar80);
    auVar64 = vmulps_avx512vl(auVar76,auVar78);
    auVar75 = vmulps_avx512vl(auVar77,auVar78);
    auVar43 = vfmadd231ps_fma(auVar64,auVar69,auVar81);
    auVar81 = vfmadd231ps_avx512vl(auVar75,auVar69,auVar67);
    auVar64 = vmulps_avx512vl(auVar78,auVar63);
    auVar76 = ZEXT1632(auVar44);
    auVar75 = vmulps_avx512vl(auVar76,auVar80);
    auVar79 = vfmadd231ps_avx512vl(auVar64,auVar69,auVar79);
    auVar74 = vfmadd231ps_avx512vl(auVar75,auVar69,auVar74);
    auVar81 = vmulps_avx512vl(auVar76,auVar81);
    auVar63 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar201 * auVar43._12_4_,
                                            CONCAT48(fVar191 * auVar43._8_4_,
                                                     CONCAT44(fVar204 * auVar43._4_4_,
                                                              fVar202 * auVar43._0_4_)))),auVar69,
                         auVar63);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar69,auVar80);
    auVar22._4_4_ = fVar204 * auVar63._4_4_;
    auVar22._0_4_ = fVar202 * auVar63._0_4_;
    auVar22._8_4_ = fVar191 * auVar63._8_4_;
    auVar22._12_4_ = fVar201 * auVar63._12_4_;
    auVar22._16_4_ = auVar63._16_4_ * 0.0;
    auVar22._20_4_ = auVar63._20_4_ * 0.0;
    auVar22._24_4_ = auVar63._24_4_ * 0.0;
    auVar22._28_4_ = auVar67._28_4_;
    auVar81 = vmulps_avx512vl(auVar76,auVar80);
    auVar67 = vfmadd231ps_avx512vl(auVar22,auVar69,auVar79);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar69);
    auVar79 = vsubps_avx512vl(auVar63,auVar79);
    auVar80 = vsubps_avx512vl(auVar80,auVar74);
    auVar79 = vmulps_avx512vl(auVar79,auVar70);
    auVar80 = vmulps_avx512vl(auVar80,auVar70);
    fVar97 = fVar206 * auVar79._0_4_;
    fVar202 = fVar206 * auVar79._4_4_;
    auVar23._4_4_ = fVar202;
    auVar23._0_4_ = fVar97;
    fVar204 = fVar206 * auVar79._8_4_;
    auVar23._8_4_ = fVar204;
    fVar191 = fVar206 * auVar79._12_4_;
    auVar23._12_4_ = fVar191;
    fVar201 = fVar206 * auVar79._16_4_;
    auVar23._16_4_ = fVar201;
    fVar203 = fVar206 * auVar79._20_4_;
    auVar23._20_4_ = fVar203;
    fVar206 = fVar206 * auVar79._24_4_;
    auVar23._24_4_ = fVar206;
    auVar23._28_4_ = auVar79._28_4_;
    auVar80 = vmulps_avx512vl(auVar189,auVar80);
    auVar69 = vpermt2ps_avx512vl(auVar67,_DAT_01feed00,auVar82);
    auVar70 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,auVar82);
    auVar190._0_4_ = auVar67._0_4_ + fVar97;
    auVar190._4_4_ = auVar67._4_4_ + fVar202;
    auVar190._8_4_ = auVar67._8_4_ + fVar204;
    auVar190._12_4_ = auVar67._12_4_ + fVar191;
    auVar190._16_4_ = auVar67._16_4_ + fVar201;
    auVar190._20_4_ = auVar67._20_4_ + fVar203;
    auVar190._24_4_ = auVar67._24_4_ + fVar206;
    auVar190._28_4_ = auVar67._28_4_ + auVar79._28_4_;
    auVar79 = vpermt2ps_avx512vl(auVar23,_DAT_01feed00,ZEXT1632(auVar42));
    auVar74 = vaddps_avx512vl(auVar81,auVar80);
    auVar80 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,ZEXT1632(auVar42));
    auVar79 = vsubps_avx(auVar69,auVar79);
    auVar80 = vsubps_avx512vl(auVar70,auVar80);
    auVar128 = ZEXT1632(auVar59);
    auVar63 = vsubps_avx512vl(auVar67,auVar128);
    auVar140 = ZEXT1632(auVar62);
    auVar64 = vsubps_avx512vl(auVar81,auVar140);
    auVar75 = vsubps_avx512vl(auVar69,auVar71);
    auVar63 = vaddps_avx512vl(auVar63,auVar75);
    auVar75 = vsubps_avx512vl(auVar70,auVar72);
    auVar64 = vaddps_avx512vl(auVar64,auVar75);
    auVar75 = vmulps_avx512vl(auVar140,auVar63);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar128,auVar64);
    auVar76 = vmulps_avx512vl(auVar65,auVar63);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar118,auVar64);
    auVar77 = vmulps_avx512vl(auVar73,auVar63);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar66,auVar64);
    auVar78 = vmulps_avx512vl(auVar72,auVar63);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar71,auVar64);
    auVar82 = vmulps_avx512vl(auVar81,auVar63);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar67,auVar64);
    auVar83 = vmulps_avx512vl(auVar74,auVar63);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar190,auVar64);
    auVar84 = vmulps_avx512vl(auVar80,auVar63);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar79,auVar64);
    auVar63 = vmulps_avx512vl(auVar70,auVar63);
    auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar69,auVar64);
    auVar64 = vminps_avx512vl(auVar75,auVar76);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar78);
    auVar64 = vminps_avx512vl(auVar64,auVar76);
    auVar76 = vmaxps_avx512vl(auVar77,auVar78);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar82,auVar83);
    auVar77 = vmaxps_avx512vl(auVar82,auVar83);
    auVar78 = vminps_avx512vl(auVar84,auVar63);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar64 = vminps_avx512vl(auVar64,auVar76);
    auVar63 = vmaxps_avx512vl(auVar84,auVar63);
    auVar63 = vmaxps_avx512vl(auVar77,auVar63);
    auVar63 = vmaxps_avx512vl(auVar75,auVar63);
    uVar12 = vcmpps_avx512vl(auVar64,local_148,2);
    uVar13 = vcmpps_avx512vl(auVar63,auVar68,5);
    bVar25 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    auVar240 = ZEXT3264(auVar68);
    if (bVar25 == 0) {
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    else {
      auVar63 = vsubps_avx512vl(auVar71,auVar128);
      auVar64 = vsubps_avx512vl(auVar72,auVar140);
      auVar75 = vsubps_avx512vl(auVar69,auVar67);
      auVar63 = vaddps_avx512vl(auVar63,auVar75);
      auVar75 = vsubps_avx512vl(auVar70,auVar81);
      auVar64 = vaddps_avx512vl(auVar64,auVar75);
      auVar75 = vmulps_avx512vl(auVar140,auVar63);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar64,auVar128);
      auVar65 = vmulps_avx512vl(auVar65,auVar63);
      auVar65 = vfnmadd213ps_avx512vl(auVar118,auVar64,auVar65);
      auVar73 = vmulps_avx512vl(auVar73,auVar63);
      auVar73 = vfnmadd213ps_avx512vl(auVar66,auVar64,auVar73);
      auVar66 = vmulps_avx512vl(auVar72,auVar63);
      auVar71 = vfnmadd231ps_avx512vl(auVar66,auVar64,auVar71);
      auVar66 = vmulps_avx512vl(auVar81,auVar63);
      auVar67 = vfnmadd231ps_avx512vl(auVar66,auVar64,auVar67);
      auVar66 = vmulps_avx512vl(auVar74,auVar63);
      auVar72 = vfnmadd213ps_avx512vl(auVar190,auVar64,auVar66);
      auVar66 = vmulps_avx512vl(auVar80,auVar63);
      auVar74 = vfnmadd213ps_avx512vl(auVar79,auVar64,auVar66);
      auVar66 = vmulps_avx512vl(auVar70,auVar63);
      auVar69 = vfnmadd231ps_avx512vl(auVar66,auVar69,auVar64);
      auVar79 = vminps_avx(auVar75,auVar65);
      auVar66 = vmaxps_avx(auVar75,auVar65);
      auVar80 = vminps_avx(auVar73,auVar71);
      auVar80 = vminps_avx(auVar79,auVar80);
      auVar79 = vmaxps_avx(auVar73,auVar71);
      auVar66 = vmaxps_avx(auVar66,auVar79);
      auVar81 = vminps_avx(auVar67,auVar72);
      auVar79 = vmaxps_avx(auVar67,auVar72);
      auVar67 = vminps_avx(auVar74,auVar69);
      auVar81 = vminps_avx(auVar81,auVar67);
      auVar81 = vminps_avx(auVar80,auVar81);
      auVar80 = vmaxps_avx(auVar74,auVar69);
      auVar79 = vmaxps_avx(auVar79,auVar80);
      auVar66 = vmaxps_avx(auVar66,auVar79);
      uVar12 = vcmpps_avx512vl(auVar66,auVar68,5);
      uVar13 = vcmpps_avx512vl(auVar81,local_148,2);
      bVar25 = bVar25 & (byte)uVar12 & (byte)uVar13;
      if (bVar25 != 0) {
        auStack_338[uVar27] = (uint)bVar25;
        uVar12 = vmovlps_avx(auVar40);
        (&uStack_128)[uVar27] = uVar12;
        uVar32 = vmovlps_avx(auVar41);
        auStack_58[uVar27] = uVar32;
        uVar27 = (ulong)((int)uVar27 + 1);
      }
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar239 = ZEXT3264(_DAT_01feed20);
    auVar238 = ZEXT1664(auVar42);
    auVar237 = ZEXT1664(auVar43);
    auVar236 = ZEXT3264(auVar68);
    auVar235 = ZEXT1664(auVar41);
    auVar234 = ZEXT1664(auVar44);
    auVar233 = ZEXT1664(auVar40);
LAB_01c952c2:
    do {
      do {
        auVar68 = auVar240._0_32_;
        if ((int)uVar27 == 0) {
          if (bVar33 != false) {
            return bVar33;
          }
          uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar17._4_4_ = uVar106;
          auVar17._0_4_ = uVar106;
          auVar17._8_4_ = uVar106;
          auVar17._12_4_ = uVar106;
          auVar17._16_4_ = uVar106;
          auVar17._20_4_ = uVar106;
          auVar17._24_4_ = uVar106;
          auVar17._28_4_ = uVar106;
          uVar12 = vcmpps_avx512vl(local_78,auVar17,2);
          uVar34 = (uint)uVar35 & (uint)uVar12;
          uVar35 = (ulong)uVar34;
          context = pRVar24;
          if (uVar34 == 0) {
            return false;
          }
          goto LAB_01c945f3;
        }
        uVar26 = (int)uVar27 - 1;
        uVar28 = (ulong)uVar26;
        uVar7 = auStack_338[uVar28];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auStack_58[uVar28];
        uVar32 = 0;
        for (uVar31 = (ulong)uVar7; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          uVar32 = uVar32 + 1;
        }
        uVar30 = uVar7 - 1 & uVar7;
        bVar38 = uVar30 == 0;
        auStack_338[uVar28] = uVar30;
        if (bVar38) {
          uVar27 = (ulong)uVar26;
        }
        auVar98._8_8_ = 0;
        auVar98._0_8_ = uVar32;
        auVar40 = vpunpcklqdq_avx(auVar98,ZEXT416((int)uVar32 + 1));
        auVar40 = vcvtqq2ps_avx512vl(auVar40);
        auVar40 = vmulps_avx512vl(auVar40,auVar237._0_16_);
        uVar106 = *(undefined4 *)((long)&uStack_128 + uVar28 * 8 + 4);
        auVar14._4_4_ = uVar106;
        auVar14._0_4_ = uVar106;
        auVar14._8_4_ = uVar106;
        auVar14._12_4_ = uVar106;
        auVar44 = vmulps_avx512vl(auVar40,auVar14);
        auVar43 = auVar238._0_16_;
        auVar40 = vsubps_avx512vl(auVar43,auVar40);
        uVar106 = *(undefined4 *)(&uStack_128 + uVar28);
        auVar15._4_4_ = uVar106;
        auVar15._0_4_ = uVar106;
        auVar15._8_4_ = uVar106;
        auVar15._12_4_ = uVar106;
        auVar40 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar15);
        auVar44 = vmovshdup_avx(auVar40);
        fVar206 = auVar44._0_4_ - auVar40._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        if (uVar7 == 0 || bVar38) goto LAB_01c94d2d;
        auVar44 = vshufps_avx(auVar41,auVar41,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        auVar51 = vsubps_avx512vl(auVar43,auVar44);
        fVar97 = auVar44._0_4_;
        auVar135._0_4_ = fVar97 * fVar102;
        fVar202 = auVar44._4_4_;
        auVar135._4_4_ = fVar202 * fVar103;
        fVar204 = auVar44._8_4_;
        auVar135._8_4_ = fVar204 * fVar102;
        fVar191 = auVar44._12_4_;
        auVar135._12_4_ = fVar191 * fVar103;
        auVar146._0_4_ = fVar97 * fVar104;
        auVar146._4_4_ = fVar202 * fVar105;
        auVar146._8_4_ = fVar204 * fVar104;
        auVar146._12_4_ = fVar191 * fVar105;
        auVar158._0_4_ = fVar119 * fVar97;
        auVar158._4_4_ = fVar130 * fVar202;
        auVar158._8_4_ = fVar119 * fVar204;
        auVar158._12_4_ = fVar130 * fVar191;
        auVar120._0_4_ = fVar131 * fVar97;
        auVar120._4_4_ = fVar132 * fVar202;
        auVar120._8_4_ = fVar131 * fVar204;
        auVar120._12_4_ = fVar132 * fVar191;
        auVar44 = vfmadd231ps_fma(auVar135,auVar51,auVar157);
        auVar42 = vfmadd231ps_fma(auVar146,auVar51,auVar48);
        auVar50 = vfmadd231ps_fma(auVar158,auVar51,auVar46);
        auVar51 = vfmadd231ps_fma(auVar120,auVar109,auVar51);
        auVar129._16_16_ = auVar44;
        auVar129._0_16_ = auVar44;
        auVar141._16_16_ = auVar42;
        auVar141._0_16_ = auVar42;
        auVar150._16_16_ = auVar50;
        auVar150._0_16_ = auVar50;
        auVar79 = vpermps_avx512vl(auVar239._0_32_,ZEXT1632(auVar40));
        auVar66 = vsubps_avx(auVar141,auVar129);
        auVar42 = vfmadd213ps_fma(auVar66,auVar79,auVar129);
        auVar66 = vsubps_avx(auVar150,auVar141);
        auVar59 = vfmadd213ps_fma(auVar66,auVar79,auVar141);
        auVar44 = vsubps_avx(auVar51,auVar50);
        auVar142._16_16_ = auVar44;
        auVar142._0_16_ = auVar44;
        auVar44 = vfmadd213ps_fma(auVar142,auVar79,auVar150);
        auVar66 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar42));
        auVar42 = vfmadd213ps_fma(auVar66,auVar79,ZEXT1632(auVar42));
        auVar66 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar59));
        auVar44 = vfmadd213ps_fma(auVar66,auVar79,ZEXT1632(auVar59));
        auVar66 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar42));
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar66,auVar79);
        auVar66 = vmulps_avx512vl(auVar66,auVar236._0_32_);
        auVar86._16_16_ = auVar66._16_16_;
        fVar97 = fVar206 * 0.33333334;
        auVar159._0_8_ =
             CONCAT44(auVar133._4_4_ + fVar97 * auVar66._4_4_,
                      auVar133._0_4_ + fVar97 * auVar66._0_4_);
        auVar159._8_4_ = auVar133._8_4_ + fVar97 * auVar66._8_4_;
        auVar159._12_4_ = auVar133._12_4_ + fVar97 * auVar66._12_4_;
        auVar136._0_4_ = fVar97 * auVar66._16_4_;
        auVar136._4_4_ = fVar97 * auVar66._20_4_;
        auVar136._8_4_ = fVar97 * auVar66._24_4_;
        auVar136._12_4_ = fVar97 * auVar66._28_4_;
        auVar58 = vsubps_avx((undefined1  [16])0x0,auVar136);
        auVar59 = vshufpd_avx(auVar133,auVar133,3);
        auVar62 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar44 = vsubps_avx(auVar59,auVar133);
        auVar42 = vsubps_avx(auVar62,(undefined1  [16])0x0);
        auVar175._0_4_ = auVar44._0_4_ + auVar42._0_4_;
        auVar175._4_4_ = auVar44._4_4_ + auVar42._4_4_;
        auVar175._8_4_ = auVar44._8_4_ + auVar42._8_4_;
        auVar175._12_4_ = auVar44._12_4_ + auVar42._12_4_;
        auVar44 = vshufps_avx(auVar133,auVar133,0xb1);
        auVar42 = vshufps_avx(auVar159,auVar159,0xb1);
        auVar50 = vshufps_avx(auVar58,auVar58,0xb1);
        auVar51 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar224._4_4_ = auVar175._0_4_;
        auVar224._0_4_ = auVar175._0_4_;
        auVar224._8_4_ = auVar175._0_4_;
        auVar224._12_4_ = auVar175._0_4_;
        auVar54 = vshufps_avx(auVar175,auVar175,0x55);
        fVar97 = auVar54._0_4_;
        auVar186._0_4_ = auVar44._0_4_ * fVar97;
        fVar202 = auVar54._4_4_;
        auVar186._4_4_ = auVar44._4_4_ * fVar202;
        fVar204 = auVar54._8_4_;
        auVar186._8_4_ = auVar44._8_4_ * fVar204;
        fVar191 = auVar54._12_4_;
        auVar186._12_4_ = auVar44._12_4_ * fVar191;
        auVar193._0_4_ = auVar42._0_4_ * fVar97;
        auVar193._4_4_ = auVar42._4_4_ * fVar202;
        auVar193._8_4_ = auVar42._8_4_ * fVar204;
        auVar193._12_4_ = auVar42._12_4_ * fVar191;
        auVar210._0_4_ = auVar50._0_4_ * fVar97;
        auVar210._4_4_ = auVar50._4_4_ * fVar202;
        auVar210._8_4_ = auVar50._8_4_ * fVar204;
        auVar210._12_4_ = auVar50._12_4_ * fVar191;
        auVar176._0_4_ = auVar51._0_4_ * fVar97;
        auVar176._4_4_ = auVar51._4_4_ * fVar202;
        auVar176._8_4_ = auVar51._8_4_ * fVar204;
        auVar176._12_4_ = auVar51._12_4_ * fVar191;
        auVar44 = vfmadd231ps_fma(auVar186,auVar224,auVar133);
        auVar42 = vfmadd231ps_fma(auVar193,auVar224,auVar159);
        auVar56 = vfmadd231ps_fma(auVar210,auVar224,auVar58);
        auVar57 = vfmadd231ps_fma(auVar176,(undefined1  [16])0x0,auVar224);
        auVar54 = vshufpd_avx(auVar44,auVar44,1);
        auVar55 = vshufpd_avx(auVar42,auVar42,1);
        auVar52 = vshufpd_avx512vl(auVar56,auVar56,1);
        auVar53 = vshufpd_avx512vl(auVar57,auVar57,1);
        auVar50 = vminss_avx(auVar44,auVar42);
        auVar44 = vmaxss_avx(auVar42,auVar44);
        auVar51 = vminss_avx(auVar56,auVar57);
        auVar42 = vmaxss_avx(auVar57,auVar56);
        auVar50 = vminss_avx(auVar50,auVar51);
        auVar44 = vmaxss_avx(auVar42,auVar44);
        auVar51 = vminss_avx(auVar54,auVar55);
        auVar42 = vmaxss_avx(auVar55,auVar54);
        auVar54 = vminss_avx512f(auVar52,auVar53);
        auVar55 = vmaxss_avx512f(auVar53,auVar52);
        auVar42 = vmaxss_avx(auVar55,auVar42);
        auVar51 = vminss_avx512f(auVar51,auVar54);
        fVar202 = auVar42._0_4_;
        fVar97 = auVar44._0_4_;
        if (auVar50._0_4_ < 0.0001) {
          bVar39 = fVar202 == -0.0001;
          bVar36 = NAN(fVar202);
          if (fVar202 <= -0.0001) goto LAB_01c954e9;
          break;
        }
LAB_01c954e9:
        vucomiss_avx512f(auVar51);
        bVar39 = fVar202 <= -0.0001;
        bVar37 = -0.0001 < fVar97;
        bVar36 = bVar39;
        if (!bVar39) break;
        uVar12 = vcmpps_avx512vl(auVar50,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar13 = vcmpps_avx512vl(auVar51,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar25 = (byte)uVar12 & (byte)uVar13 & 1;
        bVar39 = bVar37 && bVar25 == 0;
        bVar36 = bVar37 && bVar25 == 0;
      } while (!bVar37 || bVar25 != 0);
      auVar56 = auVar241._0_16_;
      vcmpss_avx512f(auVar50,auVar56,1);
      uVar12 = vcmpss_avx512f(auVar44,auVar56,1);
      bVar37 = (bool)((byte)uVar12 & 1);
      auVar86._0_16_ = auVar242._0_16_;
      auVar85._4_28_ = auVar86._4_28_;
      auVar85._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * auVar242._0_4_);
      vucomiss_avx512f(auVar85._0_16_);
      bVar36 = (bool)(!bVar39 | bVar36);
      bVar37 = bVar36 == false;
      auVar88._16_16_ = auVar86._16_16_;
      auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar87._4_28_ = auVar88._4_28_;
      auVar87._0_4_ = (uint)bVar36 * auVar241._0_4_ + (uint)!bVar36 * 0x7f800000;
      auVar55 = auVar87._0_16_;
      auVar90._16_16_ = auVar86._16_16_;
      auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (uint)bVar36 * auVar241._0_4_ + (uint)!bVar36 * -0x800000;
      auVar54 = auVar89._0_16_;
      uVar12 = vcmpss_avx512f(auVar51,auVar56,1);
      bVar39 = (bool)((byte)uVar12 & 1);
      auVar92._16_16_ = auVar86._16_16_;
      auVar92._0_16_ = auVar242._0_16_;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar242._0_4_);
      vucomiss_avx512f(auVar91._0_16_);
      if ((bVar36) || (bVar37)) {
        auVar51 = vucomiss_avx512f(auVar50);
        if ((bVar36) || (bVar37)) {
          auVar57 = vxorps_avx512vl(auVar50,auVar235._0_16_);
          auVar50 = vsubss_avx512f(auVar51,auVar50);
          auVar50 = vdivss_avx512f(auVar57,auVar50);
          auVar51 = vsubss_avx512f(ZEXT416(0x3f800000),auVar50);
          auVar51 = vfmadd213ss_avx512f(auVar51,auVar56,auVar50);
          auVar50 = auVar51;
        }
        else {
          auVar50 = vxorps_avx512vl(auVar51,auVar51);
          vucomiss_avx512f(auVar50);
          auVar51 = ZEXT416(0x3f800000);
          if ((bVar36) || (bVar37)) {
            auVar51 = SUB6416(ZEXT464(0xff800000),0);
            auVar50 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar55 = vminss_avx512f(auVar55,auVar50);
        auVar54 = vmaxss_avx(auVar51,auVar54);
      }
      auVar242 = ZEXT464(0x3f800000);
      uVar12 = vcmpss_avx512f(auVar42,auVar56,1);
      bVar39 = (bool)((byte)uVar12 & 1);
      auVar42 = auVar242._0_16_;
      fVar204 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * 0x3f800000);
      if ((auVar85._0_4_ != fVar204) || (NAN(auVar85._0_4_) || NAN(fVar204))) {
        if ((fVar202 != fVar97) || (NAN(fVar202) || NAN(fVar97))) {
          auVar44 = vxorps_avx512vl(auVar44,auVar235._0_16_);
          auVar177._0_4_ = auVar44._0_4_ / (fVar202 - fVar97);
          auVar177._4_12_ = auVar44._4_12_;
          auVar44 = vsubss_avx512f(auVar42,auVar177);
          auVar44 = vfmadd213ss_avx512f(auVar44,auVar56,auVar177);
          auVar50 = auVar44;
        }
        else if ((fVar97 != 0.0) ||
                (auVar44 = auVar42, auVar50 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar97))) {
          auVar44 = SUB6416(ZEXT464(0xff800000),0);
          auVar50 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar55 = vminss_avx(auVar55,auVar50);
        auVar54 = vmaxss_avx(auVar44,auVar54);
      }
      bVar39 = auVar91._0_4_ != fVar204;
      auVar44 = vminss_avx512f(auVar55,auVar42);
      auVar94._16_16_ = auVar86._16_16_;
      auVar94._0_16_ = auVar55;
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar39 * auVar44._0_4_ + (uint)!bVar39 * auVar55._0_4_;
      auVar44 = vmaxss_avx512f(auVar42,auVar54);
      auVar96._16_16_ = auVar86._16_16_;
      auVar96._0_16_ = auVar54;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar39 * auVar44._0_4_ + (uint)!bVar39 * auVar54._0_4_;
      auVar44 = vmaxss_avx512f(auVar56,auVar93._0_16_);
      auVar50 = vminss_avx512f(auVar95._0_16_,auVar42);
    } while (auVar50._0_4_ < auVar44._0_4_);
    auVar56 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar44._0_4_ + -0.1)));
    auVar57 = vminss_avx512f(ZEXT416((uint)(auVar50._0_4_ + 0.1)),auVar42);
    auVar121._0_8_ = auVar133._0_8_;
    auVar121._8_8_ = auVar121._0_8_;
    auVar194._8_8_ = auVar159._0_8_;
    auVar194._0_8_ = auVar159._0_8_;
    auVar211._8_8_ = auVar58._0_8_;
    auVar211._0_8_ = auVar58._0_8_;
    auVar44 = vshufpd_avx(auVar159,auVar159,3);
    auVar50 = vshufpd_avx(auVar58,auVar58,3);
    auVar51 = vshufps_avx(auVar56,auVar57,0);
    auVar55 = vsubps_avx512vl(auVar43,auVar51);
    fVar97 = auVar51._0_4_;
    auVar147._0_4_ = fVar97 * auVar59._0_4_;
    fVar202 = auVar51._4_4_;
    auVar147._4_4_ = fVar202 * auVar59._4_4_;
    fVar204 = auVar51._8_4_;
    auVar147._8_4_ = fVar204 * auVar59._8_4_;
    fVar191 = auVar51._12_4_;
    auVar147._12_4_ = fVar191 * auVar59._12_4_;
    auVar160._0_4_ = fVar97 * auVar44._0_4_;
    auVar160._4_4_ = fVar202 * auVar44._4_4_;
    auVar160._8_4_ = fVar204 * auVar44._8_4_;
    auVar160._12_4_ = fVar191 * auVar44._12_4_;
    auVar227._0_4_ = auVar50._0_4_ * fVar97;
    auVar227._4_4_ = auVar50._4_4_ * fVar202;
    auVar227._8_4_ = auVar50._8_4_ * fVar204;
    auVar227._12_4_ = auVar50._12_4_ * fVar191;
    auVar137._0_4_ = fVar97 * auVar62._0_4_;
    auVar137._4_4_ = fVar202 * auVar62._4_4_;
    auVar137._8_4_ = fVar204 * auVar62._8_4_;
    auVar137._12_4_ = fVar191 * auVar62._12_4_;
    auVar59 = vfmadd231ps_fma(auVar147,auVar55,auVar121);
    auVar62 = vfmadd231ps_fma(auVar160,auVar55,auVar194);
    auVar54 = vfmadd231ps_fma(auVar227,auVar55,auVar211);
    auVar55 = vfmadd231ps_fma(auVar137,auVar55,ZEXT816(0));
    auVar50 = vsubss_avx512f(auVar42,auVar56);
    auVar44 = vmovshdup_avx(auVar41);
    auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * auVar56._0_4_)),auVar41,auVar50);
    auVar50 = vsubss_avx512f(auVar42,auVar57);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * auVar57._0_4_)),auVar41,auVar50);
    auVar58 = vdivss_avx512f(auVar42,ZEXT416((uint)fVar206));
    auVar44 = vsubps_avx(auVar62,auVar59);
    auVar143 = auVar233._0_16_;
    auVar50 = vmulps_avx512vl(auVar44,auVar143);
    auVar44 = vsubps_avx(auVar54,auVar62);
    auVar51 = vmulps_avx512vl(auVar44,auVar143);
    auVar44 = vsubps_avx(auVar55,auVar54);
    auVar44 = vmulps_avx512vl(auVar44,auVar143);
    auVar41 = vminps_avx(auVar51,auVar44);
    auVar44 = vmaxps_avx(auVar51,auVar44);
    auVar41 = vminps_avx(auVar50,auVar41);
    auVar44 = vmaxps_avx(auVar50,auVar44);
    auVar50 = vshufpd_avx(auVar41,auVar41,3);
    auVar51 = vshufpd_avx(auVar44,auVar44,3);
    auVar41 = vminps_avx(auVar41,auVar50);
    auVar44 = vmaxps_avx(auVar44,auVar51);
    fVar206 = auVar58._0_4_;
    auVar178._0_4_ = auVar41._0_4_ * fVar206;
    auVar178._4_4_ = auVar41._4_4_ * fVar206;
    auVar178._8_4_ = auVar41._8_4_ * fVar206;
    auVar178._12_4_ = auVar41._12_4_ * fVar206;
    auVar165._0_4_ = fVar206 * auVar44._0_4_;
    auVar165._4_4_ = fVar206 * auVar44._4_4_;
    auVar165._8_4_ = fVar206 * auVar44._8_4_;
    auVar165._12_4_ = fVar206 * auVar44._12_4_;
    auVar58 = vdivss_avx512f(auVar42,ZEXT416((uint)(auVar52._0_4_ - auVar133._0_4_)));
    auVar44 = vshufpd_avx(auVar59,auVar59,3);
    auVar41 = vshufpd_avx(auVar62,auVar62,3);
    auVar50 = vshufpd_avx(auVar54,auVar54,3);
    auVar51 = vshufpd_avx(auVar55,auVar55,3);
    auVar44 = vsubps_avx(auVar44,auVar59);
    auVar59 = vsubps_avx(auVar41,auVar62);
    auVar62 = vsubps_avx(auVar50,auVar54);
    auVar51 = vsubps_avx(auVar51,auVar55);
    auVar41 = vminps_avx(auVar44,auVar59);
    auVar44 = vmaxps_avx(auVar44,auVar59);
    auVar50 = vminps_avx(auVar62,auVar51);
    auVar50 = vminps_avx(auVar41,auVar50);
    auVar41 = vmaxps_avx(auVar62,auVar51);
    auVar44 = vmaxps_avx(auVar44,auVar41);
    fVar206 = auVar58._0_4_;
    auVar212._0_4_ = fVar206 * auVar50._0_4_;
    auVar212._4_4_ = fVar206 * auVar50._4_4_;
    auVar212._8_4_ = fVar206 * auVar50._8_4_;
    auVar212._12_4_ = fVar206 * auVar50._12_4_;
    auVar195._0_4_ = fVar206 * auVar44._0_4_;
    auVar195._4_4_ = fVar206 * auVar44._4_4_;
    auVar195._8_4_ = fVar206 * auVar44._8_4_;
    auVar195._12_4_ = fVar206 * auVar44._12_4_;
    auVar51 = vinsertps_avx(auVar40,auVar133,0x10);
    auVar53 = vpermt2ps_avx512vl(auVar40,_DAT_01feecd0,auVar52);
    auVar110._0_4_ = auVar51._0_4_ + auVar53._0_4_;
    auVar110._4_4_ = auVar51._4_4_ + auVar53._4_4_;
    auVar110._8_4_ = auVar51._8_4_ + auVar53._8_4_;
    auVar110._12_4_ = auVar51._12_4_ + auVar53._12_4_;
    auVar16._8_4_ = 0x3f000000;
    auVar16._0_8_ = 0x3f0000003f000000;
    auVar16._12_4_ = 0x3f000000;
    auVar58 = vmulps_avx512vl(auVar110,auVar16);
    auVar41 = vshufps_avx(auVar58,auVar58,0x54);
    uVar106 = auVar58._0_4_;
    auVar113._4_4_ = uVar106;
    auVar113._0_4_ = uVar106;
    auVar113._8_4_ = uVar106;
    auVar113._12_4_ = uVar106;
    auVar50 = vfmadd213ps_fma(auVar49,auVar113,auVar47);
    auVar59 = vfmadd213ps_fma(local_158,auVar113,auVar4);
    auVar62 = vfmadd213ps_fma(local_168,auVar113,auVar45);
    auVar44 = vsubps_avx(auVar59,auVar50);
    auVar50 = vfmadd213ps_fma(auVar44,auVar113,auVar50);
    auVar44 = vsubps_avx(auVar62,auVar59);
    auVar44 = vfmadd213ps_fma(auVar44,auVar113,auVar59);
    auVar44 = vsubps_avx(auVar44,auVar50);
    auVar50 = vfmadd231ps_fma(auVar50,auVar44,auVar113);
    auVar54 = vmulps_avx512vl(auVar44,auVar143);
    auVar221._8_8_ = auVar50._0_8_;
    auVar221._0_8_ = auVar50._0_8_;
    auVar44 = vshufpd_avx(auVar50,auVar50,3);
    auVar50 = vshufps_avx(auVar58,auVar58,0x55);
    auVar59 = vsubps_avx(auVar44,auVar221);
    auVar62 = vfmadd231ps_fma(auVar221,auVar50,auVar59);
    auVar228._8_8_ = auVar54._0_8_;
    auVar228._0_8_ = auVar54._0_8_;
    auVar44 = vshufpd_avx(auVar54,auVar54,3);
    auVar44 = vsubps_avx512vl(auVar44,auVar228);
    auVar44 = vfmadd213ps_avx512vl(auVar44,auVar50,auVar228);
    auVar114._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
    auVar114._8_4_ = auVar59._8_4_ ^ 0x80000000;
    auVar114._12_4_ = auVar59._12_4_ ^ 0x80000000;
    auVar50 = vmovshdup_avx512vl(auVar44);
    auVar229._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
    auVar229._8_4_ = auVar50._8_4_ ^ 0x80000000;
    auVar229._12_4_ = auVar50._12_4_ ^ 0x80000000;
    auVar54 = vmovshdup_avx512vl(auVar59);
    auVar55 = vpermt2ps_avx512vl(auVar229,ZEXT416(5),auVar59);
    auVar50 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar50._0_4_ * auVar59._0_4_)),auVar44,auVar54);
    auVar59 = vpermt2ps_avx512vl(auVar44,SUB6416(ZEXT464(4),0),auVar114);
    auVar138._0_4_ = auVar50._0_4_;
    auVar138._4_4_ = auVar138._0_4_;
    auVar138._8_4_ = auVar138._0_4_;
    auVar138._12_4_ = auVar138._0_4_;
    auVar44 = vdivps_avx(auVar55,auVar138);
    auVar60 = vdivps_avx512vl(auVar59,auVar138);
    fVar206 = auVar62._0_4_;
    auVar50 = vshufps_avx(auVar62,auVar62,0x55);
    auVar222._0_4_ = fVar206 * auVar44._0_4_ + auVar50._0_4_ * auVar60._0_4_;
    auVar222._4_4_ = fVar206 * auVar44._4_4_ + auVar50._4_4_ * auVar60._4_4_;
    auVar222._8_4_ = fVar206 * auVar44._8_4_ + auVar50._8_4_ * auVar60._8_4_;
    auVar222._12_4_ = fVar206 * auVar44._12_4_ + auVar50._12_4_ * auVar60._12_4_;
    auVar56 = vsubps_avx(auVar41,auVar222);
    auVar50 = vmovshdup_avx(auVar44);
    auVar41 = vinsertps_avx(auVar178,auVar212,0x1c);
    auVar230._0_4_ = auVar50._0_4_ * auVar41._0_4_;
    auVar230._4_4_ = auVar50._4_4_ * auVar41._4_4_;
    auVar230._8_4_ = auVar50._8_4_ * auVar41._8_4_;
    auVar230._12_4_ = auVar50._12_4_ * auVar41._12_4_;
    auVar57 = vinsertps_avx512f(auVar165,auVar195,0x1c);
    auVar50 = vmulps_avx512vl(auVar50,auVar57);
    auVar55 = vminps_avx512vl(auVar230,auVar50);
    auVar62 = vmaxps_avx(auVar50,auVar230);
    auVar54 = vmovshdup_avx(auVar60);
    auVar50 = vinsertps_avx(auVar212,auVar178,0x4c);
    auVar213._0_4_ = auVar54._0_4_ * auVar50._0_4_;
    auVar213._4_4_ = auVar54._4_4_ * auVar50._4_4_;
    auVar213._8_4_ = auVar54._8_4_ * auVar50._8_4_;
    auVar213._12_4_ = auVar54._12_4_ * auVar50._12_4_;
    auVar59 = vinsertps_avx(auVar195,auVar165,0x4c);
    auVar196._0_4_ = auVar54._0_4_ * auVar59._0_4_;
    auVar196._4_4_ = auVar54._4_4_ * auVar59._4_4_;
    auVar196._8_4_ = auVar54._8_4_ * auVar59._8_4_;
    auVar196._12_4_ = auVar54._12_4_ * auVar59._12_4_;
    auVar54 = vminps_avx(auVar213,auVar196);
    auVar55 = vaddps_avx512vl(auVar55,auVar54);
    auVar54 = vmaxps_avx(auVar196,auVar213);
    auVar197._0_4_ = auVar62._0_4_ + auVar54._0_4_;
    auVar197._4_4_ = auVar62._4_4_ + auVar54._4_4_;
    auVar197._8_4_ = auVar62._8_4_ + auVar54._8_4_;
    auVar197._12_4_ = auVar62._12_4_ + auVar54._12_4_;
    auVar214._8_8_ = 0x3f80000000000000;
    auVar214._0_8_ = 0x3f80000000000000;
    auVar62 = vsubps_avx(auVar214,auVar197);
    auVar54 = vsubps_avx(auVar214,auVar55);
    auVar55 = vsubps_avx(auVar51,auVar58);
    auVar58 = vsubps_avx(auVar53,auVar58);
    fVar191 = auVar55._0_4_;
    auVar231._0_4_ = fVar191 * auVar62._0_4_;
    fVar201 = auVar55._4_4_;
    auVar231._4_4_ = fVar201 * auVar62._4_4_;
    fVar203 = auVar55._8_4_;
    auVar231._8_4_ = fVar203 * auVar62._8_4_;
    fVar205 = auVar55._12_4_;
    auVar231._12_4_ = fVar205 * auVar62._12_4_;
    auVar61 = vbroadcastss_avx512vl(auVar44);
    auVar41 = vmulps_avx512vl(auVar61,auVar41);
    auVar57 = vmulps_avx512vl(auVar61,auVar57);
    auVar61 = vminps_avx512vl(auVar41,auVar57);
    auVar57 = vmaxps_avx512vl(auVar57,auVar41);
    auVar41 = vbroadcastss_avx512vl(auVar60);
    auVar50 = vmulps_avx512vl(auVar41,auVar50);
    auVar41 = vmulps_avx512vl(auVar41,auVar59);
    auVar59 = vminps_avx512vl(auVar50,auVar41);
    auVar59 = vaddps_avx512vl(auVar61,auVar59);
    auVar55 = vmulps_avx512vl(auVar55,auVar54);
    fVar206 = auVar58._0_4_;
    auVar198._0_4_ = fVar206 * auVar62._0_4_;
    fVar97 = auVar58._4_4_;
    auVar198._4_4_ = fVar97 * auVar62._4_4_;
    fVar202 = auVar58._8_4_;
    auVar198._8_4_ = fVar202 * auVar62._8_4_;
    fVar204 = auVar58._12_4_;
    auVar198._12_4_ = fVar204 * auVar62._12_4_;
    auVar215._0_4_ = fVar206 * auVar54._0_4_;
    auVar215._4_4_ = fVar97 * auVar54._4_4_;
    auVar215._8_4_ = fVar202 * auVar54._8_4_;
    auVar215._12_4_ = fVar204 * auVar54._12_4_;
    auVar41 = vmaxps_avx(auVar41,auVar50);
    auVar166._0_4_ = auVar57._0_4_ + auVar41._0_4_;
    auVar166._4_4_ = auVar57._4_4_ + auVar41._4_4_;
    auVar166._8_4_ = auVar57._8_4_ + auVar41._8_4_;
    auVar166._12_4_ = auVar57._12_4_ + auVar41._12_4_;
    auVar179._8_8_ = 0x3f800000;
    auVar179._0_8_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar179,auVar166);
    auVar50 = vsubps_avx512vl(auVar179,auVar59);
    auVar225._0_4_ = fVar191 * auVar41._0_4_;
    auVar225._4_4_ = fVar201 * auVar41._4_4_;
    auVar225._8_4_ = fVar203 * auVar41._8_4_;
    auVar225._12_4_ = fVar205 * auVar41._12_4_;
    auVar223._0_4_ = fVar191 * auVar50._0_4_;
    auVar223._4_4_ = fVar201 * auVar50._4_4_;
    auVar223._8_4_ = fVar203 * auVar50._8_4_;
    auVar223._12_4_ = fVar205 * auVar50._12_4_;
    auVar167._0_4_ = fVar206 * auVar41._0_4_;
    auVar167._4_4_ = fVar97 * auVar41._4_4_;
    auVar167._8_4_ = fVar202 * auVar41._8_4_;
    auVar167._12_4_ = fVar204 * auVar41._12_4_;
    auVar180._0_4_ = fVar206 * auVar50._0_4_;
    auVar180._4_4_ = fVar97 * auVar50._4_4_;
    auVar180._8_4_ = fVar202 * auVar50._8_4_;
    auVar180._12_4_ = fVar204 * auVar50._12_4_;
    auVar41 = vminps_avx(auVar225,auVar223);
    auVar50 = vminps_avx512vl(auVar167,auVar180);
    auVar59 = vminps_avx512vl(auVar41,auVar50);
    auVar41 = vmaxps_avx(auVar223,auVar225);
    auVar50 = vmaxps_avx(auVar180,auVar167);
    auVar50 = vmaxps_avx(auVar50,auVar41);
    auVar62 = vminps_avx512vl(auVar231,auVar55);
    auVar41 = vminps_avx(auVar198,auVar215);
    auVar41 = vminps_avx(auVar62,auVar41);
    auVar41 = vhaddps_avx(auVar59,auVar41);
    auVar62 = vmaxps_avx512vl(auVar55,auVar231);
    auVar59 = vmaxps_avx(auVar215,auVar198);
    auVar59 = vmaxps_avx(auVar59,auVar62);
    auVar50 = vhaddps_avx(auVar50,auVar59);
    auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
    auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
    auVar168._0_4_ = auVar41._0_4_ + auVar56._0_4_;
    auVar168._4_4_ = auVar41._4_4_ + auVar56._4_4_;
    auVar168._8_4_ = auVar41._8_4_ + auVar56._8_4_;
    auVar168._12_4_ = auVar41._12_4_ + auVar56._12_4_;
    auVar181._0_4_ = auVar50._0_4_ + auVar56._0_4_;
    auVar181._4_4_ = auVar50._4_4_ + auVar56._4_4_;
    auVar181._8_4_ = auVar50._8_4_ + auVar56._8_4_;
    auVar181._12_4_ = auVar50._12_4_ + auVar56._12_4_;
    auVar41 = vmaxps_avx(auVar51,auVar168);
    auVar50 = vminps_avx(auVar181,auVar53);
    uVar32 = vcmpps_avx512vl(auVar50,auVar41,1);
    auVar41 = ZEXT416(5);
    if ((uVar32 & 3) != 0) {
      auVar40 = vxorps_avx512vl(ZEXT416(5),auVar41);
      auVar241 = ZEXT1664(auVar40);
      goto LAB_01c952c2;
    }
    uVar32 = vcmpps_avx512vl(auVar181,auVar53,1);
    uVar12 = vcmpps_avx512vl(auVar40,auVar168,1);
    if (((ushort)uVar12 & (ushort)uVar32 & 1) == 0) {
      bVar25 = 0;
    }
    else {
      auVar50 = vmovshdup_avx(auVar168);
      bVar25 = auVar133._0_4_ < auVar50._0_4_ & (byte)(uVar32 >> 1) & 0x7f;
    }
    auVar41 = vxorps_avx512vl(auVar41,auVar41);
    auVar241 = ZEXT1664(auVar41);
    if (((3 < (uint)uVar27 || uVar7 != 0 && !bVar38) | bVar25) == 1) {
      lVar29 = 200;
      do {
        auVar40 = vsubss_avx512f(auVar42,auVar56);
        fVar202 = auVar40._0_4_;
        fVar206 = fVar202 * fVar202 * fVar202;
        fVar204 = auVar56._0_4_;
        fVar97 = fVar204 * 3.0 * fVar202 * fVar202;
        fVar202 = fVar202 * fVar204 * fVar204 * 3.0;
        auVar127._4_4_ = fVar206;
        auVar127._0_4_ = fVar206;
        auVar127._8_4_ = fVar206;
        auVar127._12_4_ = fVar206;
        auVar122._4_4_ = fVar97;
        auVar122._0_4_ = fVar97;
        auVar122._8_4_ = fVar97;
        auVar122._12_4_ = fVar97;
        auVar99._4_4_ = fVar202;
        auVar99._0_4_ = fVar202;
        auVar99._8_4_ = fVar202;
        auVar99._12_4_ = fVar202;
        fVar204 = fVar204 * fVar204 * fVar204;
        auVar148._0_4_ = (float)local_348._0_4_ * fVar204;
        auVar148._4_4_ = (float)local_348._4_4_ * fVar204;
        auVar148._8_4_ = fStack_340 * fVar204;
        auVar148._12_4_ = fStack_33c * fVar204;
        auVar40 = vfmadd231ps_fma(auVar148,auVar45,auVar99);
        auVar40 = vfmadd231ps_fma(auVar40,auVar4,auVar122);
        auVar40 = vfmadd231ps_fma(auVar40,auVar47,auVar127);
        auVar100._8_8_ = auVar40._0_8_;
        auVar100._0_8_ = auVar40._0_8_;
        auVar40 = vshufpd_avx(auVar40,auVar40,3);
        auVar50 = vshufps_avx(auVar56,auVar56,0x55);
        auVar40 = vsubps_avx(auVar40,auVar100);
        auVar50 = vfmadd213ps_fma(auVar40,auVar50,auVar100);
        fVar206 = auVar50._0_4_;
        auVar40 = vshufps_avx(auVar50,auVar50,0x55);
        auVar101._0_4_ = auVar44._0_4_ * fVar206 + auVar60._0_4_ * auVar40._0_4_;
        auVar101._4_4_ = auVar44._4_4_ * fVar206 + auVar60._4_4_ * auVar40._4_4_;
        auVar101._8_4_ = auVar44._8_4_ * fVar206 + auVar60._8_4_ * auVar40._8_4_;
        auVar101._12_4_ = auVar44._12_4_ * fVar206 + auVar60._12_4_ * auVar40._12_4_;
        auVar56 = vsubps_avx(auVar56,auVar101);
        auVar40 = vandps_avx512vl(auVar50,auVar234._0_16_);
        auVar50 = vprolq_avx512vl(auVar40,0x20);
        auVar40 = vmaxss_avx(auVar50,auVar40);
        bVar38 = auVar40._0_4_ <= (float)local_358._0_4_;
        if (auVar40._0_4_ < (float)local_358._0_4_) {
          auVar40 = vucomiss_avx512f(auVar41);
          if (bVar38) {
            auVar44 = vucomiss_avx512f(auVar40);
            auVar242 = ZEXT1664(auVar44);
            if (bVar38) {
              vmovshdup_avx(auVar40);
              auVar44 = vucomiss_avx512f(auVar41);
              if (bVar38) {
                auVar42 = vucomiss_avx512f(auVar44);
                auVar242 = ZEXT1664(auVar42);
                if (bVar38) {
                  auVar50 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar56 = vinsertps_avx(auVar50,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar50 = vdpps_avx(auVar56,local_178,0x7f);
                  auVar51 = vdpps_avx(auVar56,local_188,0x7f);
                  auVar59 = vdpps_avx(auVar56,local_198,0x7f);
                  auVar62 = vdpps_avx(auVar56,local_1a8,0x7f);
                  auVar54 = vdpps_avx(auVar56,local_1b8,0x7f);
                  auVar55 = vdpps_avx(auVar56,local_1c8,0x7f);
                  auVar58 = vdpps_avx(auVar56,local_1d8,0x7f);
                  auVar56 = vdpps_avx(auVar56,local_1e8,0x7f);
                  auVar57 = vsubss_avx512f(auVar42,auVar44);
                  fVar206 = auVar44._0_4_;
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar54._0_4_)),auVar57,auVar50
                                           );
                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar206)),auVar57,auVar51
                                           );
                  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar206)),auVar57,auVar59
                                           );
                  auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar56._0_4_)),auVar57,auVar62
                                           );
                  auVar42 = vsubss_avx512f(auVar42,auVar40);
                  auVar161._0_4_ = auVar42._0_4_;
                  fVar206 = auVar161._0_4_ * auVar161._0_4_ * auVar161._0_4_;
                  local_d8 = auVar40._0_4_;
                  fVar97 = local_d8 * 3.0 * auVar161._0_4_ * auVar161._0_4_;
                  fVar202 = auVar161._0_4_ * local_d8 * local_d8 * 3.0;
                  fVar204 = local_d8 * local_d8 * local_d8;
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar59._0_4_)),
                                            ZEXT416((uint)fVar202),auVar51);
                  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar97),auVar50);
                  vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar206),auVar44);
                  auVar44 = vucomiss_avx512f(ZEXT416(uVar1));
                  if (bVar38) {
                    fVar191 = *(float *)(ray + k * 4 + 0x80);
                    if (auVar44._0_4_ <= fVar191) {
                      local_c8 = vshufps_avx(auVar40,auVar40,0x55);
                      auVar50 = vsubps_avx512vl(auVar43,local_c8);
                      fVar201 = local_c8._0_4_;
                      auVar182._0_4_ = fVar201 * (float)local_208._0_4_;
                      fVar203 = local_c8._4_4_;
                      auVar182._4_4_ = fVar203 * (float)local_208._4_4_;
                      fVar205 = local_c8._8_4_;
                      auVar182._8_4_ = fVar205 * fStack_200;
                      fVar207 = local_c8._12_4_;
                      auVar182._12_4_ = fVar207 * fStack_1fc;
                      auVar187._0_4_ = fVar201 * (float)local_258._0_4_;
                      auVar187._4_4_ = fVar203 * (float)local_258._4_4_;
                      auVar187._8_4_ = fVar205 * fStack_250;
                      auVar187._12_4_ = fVar207 * fStack_24c;
                      auVar199._0_4_ = fVar201 * (float)local_268._0_4_;
                      auVar199._4_4_ = fVar203 * (float)local_268._4_4_;
                      auVar199._8_4_ = fVar205 * fStack_260;
                      auVar199._12_4_ = fVar207 * fStack_25c;
                      auVar216._0_4_ = fVar201 * (float)local_228._0_4_;
                      auVar216._4_4_ = fVar203 * (float)local_228._4_4_;
                      auVar216._8_4_ = fVar205 * fStack_220;
                      auVar216._12_4_ = fVar207 * fStack_21c;
                      auVar40 = vfmadd231ps_fma(auVar182,auVar50,local_1f8);
                      auVar43 = vfmadd231ps_fma(auVar187,auVar50,local_238);
                      auVar42 = vfmadd231ps_fma(auVar199,auVar50,local_248);
                      auVar50 = vfmadd231ps_fma(auVar216,auVar50,local_218);
                      auVar40 = vsubps_avx(auVar43,auVar40);
                      auVar43 = vsubps_avx(auVar42,auVar43);
                      auVar42 = vsubps_avx(auVar50,auVar42);
                      auVar200._0_4_ = auVar43._0_4_ * local_d8;
                      auVar200._4_4_ = auVar43._4_4_ * local_d8;
                      auVar200._8_4_ = auVar43._8_4_ * local_d8;
                      auVar200._12_4_ = auVar43._12_4_ * local_d8;
                      auVar161._4_4_ = auVar161._0_4_;
                      auVar161._8_4_ = auVar161._0_4_;
                      auVar161._12_4_ = auVar161._0_4_;
                      auVar40 = vfmadd231ps_fma(auVar200,auVar161,auVar40);
                      auVar169._0_4_ = auVar42._0_4_ * local_d8;
                      auVar169._4_4_ = auVar42._4_4_ * local_d8;
                      auVar169._8_4_ = auVar42._8_4_ * local_d8;
                      auVar169._12_4_ = auVar42._12_4_ * local_d8;
                      auVar43 = vfmadd231ps_fma(auVar169,auVar161,auVar43);
                      auVar170._0_4_ = auVar43._0_4_ * local_d8;
                      auVar170._4_4_ = auVar43._4_4_ * local_d8;
                      auVar170._8_4_ = auVar43._8_4_ * local_d8;
                      auVar170._12_4_ = auVar43._12_4_ * local_d8;
                      auVar40 = vfmadd231ps_fma(auVar170,auVar161,auVar40);
                      auVar40 = vmulps_avx512vl(auVar40,auVar143);
                      pGVar8 = (pRVar24->scene->geometries).items[uVar34].ptr;
                      if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar25 = 0;
                      }
                      else if ((pRVar24->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar25 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_2f8 = auVar68;
                        auVar149._0_4_ = fVar204 * (float)local_2b8._0_4_;
                        auVar149._4_4_ = fVar204 * (float)local_2b8._4_4_;
                        auVar149._8_4_ = fVar204 * fStack_2b0;
                        auVar149._12_4_ = fVar204 * fStack_2ac;
                        auVar139._4_4_ = fVar202;
                        auVar139._0_4_ = fVar202;
                        auVar139._8_4_ = fVar202;
                        auVar139._12_4_ = fVar202;
                        auVar43 = vfmadd132ps_fma(auVar139,auVar149,local_2a8);
                        auVar123._4_4_ = fVar97;
                        auVar123._0_4_ = fVar97;
                        auVar123._8_4_ = fVar97;
                        auVar123._12_4_ = fVar97;
                        auVar43 = vfmadd132ps_fma(auVar123,auVar43,local_298);
                        auVar115._4_4_ = fVar206;
                        auVar115._0_4_ = fVar206;
                        auVar115._8_4_ = fVar206;
                        auVar115._12_4_ = fVar206;
                        auVar50 = vfmadd132ps_fma(auVar115,auVar43,local_288);
                        auVar43 = vshufps_avx(auVar50,auVar50,0xc9);
                        auVar42 = vshufps_avx(auVar40,auVar40,0xc9);
                        auVar116._0_4_ = auVar50._0_4_ * auVar42._0_4_;
                        auVar116._4_4_ = auVar50._4_4_ * auVar42._4_4_;
                        auVar116._8_4_ = auVar50._8_4_ * auVar42._8_4_;
                        auVar116._12_4_ = auVar50._12_4_ * auVar42._12_4_;
                        auVar43 = vfmsub231ps_fma(auVar116,auVar40,auVar43);
                        auVar40 = vshufps_avx(auVar43,auVar43,0x55);
                        local_f8 = vshufps_avx(auVar43,auVar43,0xaa);
                        local_e8 = auVar43._0_4_;
                        local_108[0] = (RTCHitN)auVar40[0];
                        local_108[1] = (RTCHitN)auVar40[1];
                        local_108[2] = (RTCHitN)auVar40[2];
                        local_108[3] = (RTCHitN)auVar40[3];
                        local_108[4] = (RTCHitN)auVar40[4];
                        local_108[5] = (RTCHitN)auVar40[5];
                        local_108[6] = (RTCHitN)auVar40[6];
                        local_108[7] = (RTCHitN)auVar40[7];
                        local_108[8] = (RTCHitN)auVar40[8];
                        local_108[9] = (RTCHitN)auVar40[9];
                        local_108[10] = (RTCHitN)auVar40[10];
                        local_108[0xb] = (RTCHitN)auVar40[0xb];
                        local_108[0xc] = (RTCHitN)auVar40[0xc];
                        local_108[0xd] = (RTCHitN)auVar40[0xd];
                        local_108[0xe] = (RTCHitN)auVar40[0xe];
                        local_108[0xf] = (RTCHitN)auVar40[0xf];
                        uStack_e4 = local_e8;
                        uStack_e0 = local_e8;
                        uStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        local_b8 = local_278._0_8_;
                        uStack_b0 = local_278._8_8_;
                        local_a8 = local_2c8;
                        vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                        uStack_94 = pRVar24->user->instID[0];
                        local_98 = uStack_94;
                        uStack_90 = uStack_94;
                        uStack_8c = uStack_94;
                        uStack_88 = pRVar24->user->instPrimID[0];
                        uStack_84 = uStack_88;
                        uStack_80 = uStack_88;
                        uStack_7c = uStack_88;
                        *(float *)(ray + k * 4 + 0x80) = auVar44._0_4_;
                        local_378 = local_2d8;
                        local_328.valid = (int *)local_378;
                        local_328.geometryUserPtr = pGVar8->userPtr;
                        local_328.context = pRVar24->user;
                        local_328.ray = (RTCRayN *)ray;
                        local_328.hit = local_108;
                        local_328.N = 4;
                        if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->occlusionFilterN)(&local_328);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar238 = ZEXT1664(auVar40);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar235 = ZEXT1664(auVar40);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar233 = ZEXT1664(auVar40);
                        }
                        uVar32 = vptestmd_avx512vl(local_378,local_378);
                        if ((uVar32 & 0xf) == 0) {
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar234 = ZEXT1664(auVar40);
                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar236 = ZEXT3264(auVar68);
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar237 = ZEXT1664(auVar40);
                          auVar239 = ZEXT3264(_DAT_01feed20);
                          auVar40 = vxorps_avx512vl(auVar41,auVar41);
                          auVar241 = ZEXT1664(auVar40);
                          auVar240 = ZEXT3264(local_2f8);
                        }
                        else {
                          p_Var9 = pRVar24->args->filter;
                          if (p_Var9 == (RTCFilterFunctionN)0x0) {
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar234 = ZEXT1664(auVar40);
                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar236 = ZEXT3264(auVar68);
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar237 = ZEXT1664(auVar40);
                            auVar239 = ZEXT3264(_DAT_01feed20);
                            auVar40 = vxorps_avx512vl(auVar41,auVar41);
                            auVar241 = ZEXT1664(auVar40);
                            auVar240 = ZEXT3264(local_2f8);
                          }
                          else {
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar234 = ZEXT1664(auVar40);
                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar236 = ZEXT3264(auVar68);
                            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar237 = ZEXT1664(auVar40);
                            auVar239 = ZEXT3264(_DAT_01feed20);
                            auVar40 = vxorps_avx512vl(auVar41,auVar41);
                            auVar241 = ZEXT1664(auVar40);
                            auVar240 = ZEXT3264(local_2f8);
                            if (((pRVar24->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var9)(&local_328);
                              auVar240 = ZEXT3264(local_2f8);
                              auVar40 = vxorps_avx512vl(auVar40,auVar40);
                              auVar241 = ZEXT1664(auVar40);
                              auVar239 = ZEXT3264(_DAT_01feed20);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar238 = ZEXT1664(auVar40);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar237 = ZEXT1664(auVar40);
                              auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar236 = ZEXT3264(auVar68);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar235 = ZEXT1664(auVar40);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar234 = ZEXT1664(auVar40);
                              auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar233 = ZEXT1664(auVar40);
                            }
                          }
                          auVar242 = ZEXT464(0x3f800000);
                          uVar32 = vptestmd_avx512vl(local_378,local_378);
                          uVar32 = uVar32 & 0xf;
                          auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar38 = (bool)((byte)uVar32 & 1);
                          bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar36 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar37 = SUB81(uVar32 >> 3,0);
                          *(uint *)(local_328.ray + 0x80) =
                               (uint)bVar38 * auVar40._0_4_ |
                               (uint)!bVar38 * *(int *)(local_328.ray + 0x80);
                          *(uint *)(local_328.ray + 0x84) =
                               (uint)bVar39 * auVar40._4_4_ |
                               (uint)!bVar39 * *(int *)(local_328.ray + 0x84);
                          *(uint *)(local_328.ray + 0x88) =
                               (uint)bVar36 * auVar40._8_4_ |
                               (uint)!bVar36 * *(int *)(local_328.ray + 0x88);
                          *(uint *)(local_328.ray + 0x8c) =
                               (uint)bVar37 * auVar40._12_4_ |
                               (uint)!bVar37 * *(int *)(local_328.ray + 0x8c);
                          bVar25 = 1;
                          if ((byte)uVar32 != 0) goto LAB_01c96138;
                        }
                        auVar242 = ZEXT464(0x3f800000);
                        *(float *)(ray + k * 4 + 0x80) = fVar191;
                        bVar25 = 0;
                      }
LAB_01c96138:
                      bVar33 = (bool)(bVar33 | bVar25);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar29 = lVar29 + -1;
      } while (lVar29 != 0);
      goto LAB_01c952c2;
    }
    auVar41 = vinsertps_avx(auVar133,auVar52,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }